

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase50::run(TestCase50 *this)

{
  String *pSVar1;
  UserInfo *pUVar2;
  initializer_list<kj::StringPtr> init;
  initializer_list<kj::StringPtr> init_00;
  initializer_list<kj::StringPtr> init_01;
  initializer_list<kj::StringPtr> init_02;
  initializer_list<kj::StringPtr> init_03;
  initializer_list<kj::StringPtr> init_04;
  initializer_list<kj::StringPtr> init_05;
  initializer_list<kj::StringPtr> init_06;
  initializer_list<kj::StringPtr> init_07;
  initializer_list<kj::StringPtr> init_08;
  initializer_list<kj::StringPtr> init_09;
  bool bVar3;
  size_t sVar4;
  QueryParam *pQVar5;
  String **ppSVar6;
  UserInfo **ppUVar7;
  bool local_2d5c;
  bool local_2d5b;
  undefined1 auStack_2d58 [4];
  bool _kj_shouldLog_140;
  bool _kj_shouldLog_139;
  ArrayPtr<const_char> local_2d48;
  undefined1 local_2d38 [8];
  Url url_20;
  undefined1 auStack_2c50 [4];
  bool _kj_shouldLog_138;
  bool _kj_shouldLog_137;
  ArrayPtr<const_char> local_2c40;
  undefined1 local_2c30 [8];
  Url url_19;
  ArrayPtr<const_char> local_2b48;
  ArrayPtr<const_char> local_2b38;
  Url local_2b28;
  undefined2 local_2a42;
  ArrayPtr<const_char> local_2a40;
  ArrayPtr<const_char> local_2a30;
  Url local_2a20;
  undefined2 local_293a;
  ArrayPtr<const_char> local_2938;
  ArrayPtr<const_char> local_2928;
  Url local_2918;
  undefined2 local_2832;
  ArrayPtr<const_char> local_2830;
  ArrayPtr<const_char> local_2820;
  Url local_2810;
  undefined2 local_272a;
  ArrayPtr<const_char> local_2728;
  ArrayPtr<const_char> local_2718;
  Url local_2708;
  undefined2 local_2622;
  ArrayPtr<const_char> local_2620;
  ArrayPtr<const_char> local_2610;
  Url local_2600;
  undefined2 local_251a;
  ArrayPtr<const_char> local_2518;
  ArrayPtr<const_char> local_2508;
  Url local_24f8;
  undefined2 local_2412;
  ArrayPtr<const_char> local_2410;
  ArrayPtr<const_char> local_2400;
  Url local_23f0;
  undefined2 local_230a;
  ArrayPtr<const_char> local_2308;
  ArrayPtr<const_char> local_22f8;
  Url local_22e8;
  undefined2 local_2202;
  ArrayPtr<const_char> local_2200;
  ArrayPtr<const_char> local_21f0;
  Url local_21e0;
  undefined2 local_20fa;
  ArrayPtr<const_char> local_20f8;
  ArrayPtr<const_char> local_20e8;
  Url local_20d8;
  bool local_1ff1;
  undefined1 local_1ff0 [7];
  bool _kj_shouldLog_136;
  StringPtr local_1fe0;
  iterator local_1fd0;
  undefined8 local_1fc8;
  ArrayPtr<const_kj::StringPtr> local_1fc0;
  ArrayPtr<kj::String> local_1fb0;
  undefined2 local_1f9a;
  ArrayPtr<const_char> local_1f98;
  ArrayPtr<const_char> local_1f88;
  undefined1 local_1f78 [8];
  Url url_18;
  bool _kj_shouldLog_135;
  void *pvStack_1e90;
  bool _kj_shouldLog_134;
  bool local_1e82;
  bool local_1e81;
  undefined1 local_1e80 [6];
  bool _kj_shouldLog_133;
  bool _kj_shouldLog_132;
  iterator local_1e70;
  undefined8 local_1e68;
  ArrayPtr<const_kj::StringPtr> local_1e60;
  ArrayPtr<kj::String> local_1e50;
  bool local_1e39;
  undefined1 local_1e38 [7];
  bool _kj_shouldLog_131;
  bool local_1e22;
  bool local_1e21;
  undefined1 local_1e20 [6];
  bool _kj_shouldLog_130;
  bool _kj_shouldLog_129;
  undefined2 local_1e0a;
  ArrayPtr<const_char> local_1e08;
  ArrayPtr<const_char> local_1df8;
  undefined1 local_1de8 [8];
  Url url_17;
  bool _kj_shouldLog_128;
  void *pvStack_1d00;
  bool _kj_shouldLog_127;
  bool local_1cf2;
  bool local_1cf1;
  bool _kj_shouldLog_126;
  void *pvStack_1cf0;
  bool _kj_shouldLog_125;
  bool local_1ce1;
  undefined1 local_1ce0 [7];
  bool _kj_shouldLog_124;
  bool local_1cc9;
  undefined1 local_1cc8 [7];
  bool _kj_shouldLog_123;
  String *local_1cb8;
  Fault local_1cb0;
  String *local_1ca8;
  String *_kj_result_11;
  undefined1 local_1c98 [7];
  bool _kj_shouldLog_122;
  UserInfo *local_1c88;
  Fault local_1c80;
  UserInfo *local_1c78;
  UserInfo *_kj_result_10;
  UserInfo *user_1;
  undefined1 local_1c60 [7];
  bool _kj_shouldLog_121;
  undefined2 local_1c4a;
  ArrayPtr<const_char> local_1c48;
  ArrayPtr<const_char> local_1c38;
  undefined1 local_1c28 [8];
  Url url_16;
  bool _kj_shouldLog_120;
  void *pvStack_1b40;
  bool _kj_shouldLog_119;
  bool local_1b32;
  bool local_1b31;
  bool _kj_shouldLog_118;
  void *pvStack_1b30;
  bool _kj_shouldLog_117;
  bool local_1b21;
  undefined1 local_1b20 [7];
  bool _kj_shouldLog_116;
  bool local_1b0a;
  bool local_1b09;
  undefined1 local_1b08 [6];
  bool _kj_shouldLog_115;
  bool _kj_shouldLog_114;
  UserInfo *local_1af8;
  Fault local_1af0;
  UserInfo *local_1ae8;
  UserInfo *_kj_result_9;
  UserInfo *user;
  undefined1 local_1ad0 [7];
  bool _kj_shouldLog_113;
  undefined2 local_1aba;
  ArrayPtr<const_char> local_1ab8;
  ArrayPtr<const_char> local_1aa8;
  undefined1 local_1a98 [8];
  Url url_15;
  undefined1 local_19b0 [7];
  bool _kj_shouldLog_112;
  String *local_19a0;
  Fault local_1998;
  String *local_1990;
  String *_kj_result_8;
  void *pvStack_1980;
  bool _kj_shouldLog_111;
  bool local_1972;
  bool local_1971;
  bool _kj_shouldLog_110;
  void *pvStack_1970;
  bool _kj_shouldLog_109;
  bool local_1961;
  undefined1 local_1960 [7];
  bool _kj_shouldLog_108;
  bool local_194a;
  bool local_1949;
  undefined1 local_1948 [6];
  bool _kj_shouldLog_107;
  bool _kj_shouldLog_106;
  undefined2 local_1932;
  ArrayPtr<const_char> local_1930;
  ArrayPtr<const_char> local_1920;
  undefined1 local_1910 [8];
  Url url_14;
  undefined1 local_1828 [7];
  bool _kj_shouldLog_105;
  String *local_1818;
  Fault local_1810;
  String *local_1808;
  String *_kj_result_7;
  void *pvStack_17f8;
  bool _kj_shouldLog_104;
  bool local_17ea;
  bool local_17e9;
  bool _kj_shouldLog_103;
  void *pvStack_17e8;
  bool _kj_shouldLog_102;
  bool local_17d9;
  undefined1 local_17d8 [7];
  bool _kj_shouldLog_101;
  bool local_17c2;
  bool local_17c1;
  undefined1 local_17c0 [6];
  bool _kj_shouldLog_100;
  bool _kj_shouldLog_99;
  undefined2 local_17aa;
  ArrayPtr<const_char> local_17a8;
  ArrayPtr<const_char> local_1798;
  undefined1 local_1788 [8];
  Url url_13;
  undefined1 local_16a0 [7];
  bool _kj_shouldLog_98;
  String *local_1690;
  Fault local_1688;
  String *local_1680;
  String *_kj_result_6;
  void *pvStack_1670;
  bool _kj_shouldLog_97;
  bool local_1662;
  bool local_1661;
  undefined1 local_1660 [6];
  bool _kj_shouldLog_96;
  bool _kj_shouldLog_95;
  StringPtr local_1650;
  iterator local_1640;
  undefined8 local_1638;
  ArrayPtr<const_kj::StringPtr> local_1630;
  ArrayPtr<kj::String> local_1620;
  bool local_1609;
  undefined1 local_1608 [7];
  bool _kj_shouldLog_94;
  bool local_15f2;
  bool local_15f1;
  undefined1 local_15f0 [6];
  bool _kj_shouldLog_93;
  bool _kj_shouldLog_92;
  undefined2 local_15da;
  ArrayPtr<const_char> local_15d8;
  ArrayPtr<const_char> local_15c8;
  undefined1 local_15b8 [8];
  Url url_12;
  undefined1 local_14d0 [7];
  bool _kj_shouldLog_91;
  String *local_14c0;
  Fault local_14b8;
  String *local_14b0;
  String *_kj_result_5;
  void *pvStack_14a0;
  bool _kj_shouldLog_90;
  bool local_1492;
  bool local_1491;
  undefined1 local_1490 [6];
  bool _kj_shouldLog_89;
  bool _kj_shouldLog_88;
  StringPtr local_1480;
  iterator local_1470;
  undefined8 local_1468;
  ArrayPtr<const_kj::StringPtr> local_1460;
  ArrayPtr<kj::String> local_1450;
  bool local_1439;
  undefined1 local_1438 [7];
  bool _kj_shouldLog_87;
  bool local_1422;
  bool local_1421;
  undefined1 local_1420 [6];
  bool _kj_shouldLog_86;
  bool _kj_shouldLog_85;
  undefined2 local_140a;
  ArrayPtr<const_char> local_1408;
  ArrayPtr<const_char> local_13f8;
  undefined1 local_13e8 [8];
  Url url_11;
  undefined1 local_1300 [7];
  bool _kj_shouldLog_84;
  bool local_12e9;
  undefined1 local_12e8 [7];
  bool _kj_shouldLog_83;
  Fault local_12d8;
  Fault f_5;
  ArrayPtr<const_char> local_12c8;
  ArrayPtr<const_char> local_12b8;
  undefined1 local_12a8 [8];
  Url url_10;
  undefined1 local_11c0 [7];
  bool _kj_shouldLog_82;
  String *local_11b0;
  Fault local_11a8;
  String *local_11a0;
  String *_kj_result_4;
  undefined1 local_1190 [7];
  bool _kj_shouldLog_81;
  bool local_1179;
  undefined1 local_1178 [7];
  bool _kj_shouldLog_80;
  Fault local_1168;
  Fault f_4;
  undefined1 local_1158 [6];
  bool _kj_shouldLog_79;
  bool _kj_shouldLog_78;
  StringPtr local_1148;
  iterator local_1138;
  undefined8 local_1130;
  ArrayPtr<const_kj::StringPtr> local_1128;
  ArrayPtr<kj::String> local_1118;
  bool local_1101;
  undefined1 local_1100 [7];
  bool _kj_shouldLog_77;
  bool local_10ea;
  bool local_10e9;
  undefined1 local_10e8 [6];
  bool _kj_shouldLog_76;
  bool _kj_shouldLog_75;
  undefined2 local_10d2;
  ArrayPtr<const_char> local_10d0;
  ArrayPtr<const_char> local_10c0;
  undefined1 local_10b0 [8];
  Url url_9;
  undefined1 local_fc8 [7];
  bool _kj_shouldLog_74;
  String *local_fb8;
  Fault local_fb0;
  String *local_fa8;
  String *_kj_result_3;
  undefined1 local_f98 [7];
  bool _kj_shouldLog_73;
  bool local_f81;
  undefined1 local_f80 [7];
  bool _kj_shouldLog_72;
  bool local_f69;
  undefined1 local_f68 [7];
  bool _kj_shouldLog_71;
  bool local_f51;
  undefined1 local_f50 [7];
  bool _kj_shouldLog_70;
  Fault local_f40;
  Fault f_3;
  undefined1 local_f30 [6];
  bool _kj_shouldLog_69;
  bool _kj_shouldLog_68;
  StringPtr local_f20;
  iterator local_f10;
  undefined8 local_f08;
  ArrayPtr<const_kj::StringPtr> local_f00;
  ArrayPtr<kj::String> local_ef0;
  bool local_ed9;
  undefined1 local_ed8 [7];
  bool _kj_shouldLog_67;
  bool local_ec2;
  bool local_ec1;
  undefined1 local_ec0 [6];
  bool _kj_shouldLog_66;
  bool _kj_shouldLog_65;
  undefined2 local_eaa;
  ArrayPtr<const_char> local_ea8;
  ArrayPtr<const_char> local_e98;
  undefined1 local_e88 [8];
  Url url_8;
  undefined1 local_da0 [7];
  bool _kj_shouldLog_64;
  String *local_d90;
  Fault local_d88;
  String *local_d80;
  String *_kj_result_2;
  undefined1 local_d70 [7];
  bool _kj_shouldLog_63;
  bool local_d59;
  undefined1 local_d58 [7];
  bool _kj_shouldLog_62;
  bool local_d41;
  undefined1 local_d40 [7];
  bool _kj_shouldLog_61;
  bool local_d29;
  undefined1 local_d28 [7];
  bool _kj_shouldLog_60;
  Fault local_d18;
  Fault f_2;
  undefined1 local_d08 [6];
  bool _kj_shouldLog_59;
  bool _kj_shouldLog_58;
  StringPtr local_cf8;
  iterator local_ce8;
  undefined8 local_ce0;
  ArrayPtr<const_kj::StringPtr> local_cd8;
  ArrayPtr<kj::String> local_cc8;
  bool local_cb1;
  undefined1 local_cb0 [7];
  bool _kj_shouldLog_57;
  bool local_c9a;
  bool local_c99;
  undefined1 local_c98 [6];
  bool _kj_shouldLog_56;
  bool _kj_shouldLog_55;
  undefined2 local_c82;
  ArrayPtr<const_char> local_c80;
  ArrayPtr<const_char> local_c70;
  undefined1 local_c60 [8];
  Url url_7;
  undefined1 local_b78 [7];
  bool _kj_shouldLog_54;
  String *local_b68;
  Fault local_b60;
  String *local_b58;
  String *_kj_result_1;
  undefined1 local_b48 [6];
  bool _kj_shouldLog_53;
  bool _kj_shouldLog_52;
  bool local_b31;
  undefined1 local_b30 [7];
  bool _kj_shouldLog_51;
  bool local_b19;
  undefined1 local_b18 [7];
  bool _kj_shouldLog_50;
  Fault local_b08;
  Fault f_1;
  undefined1 local_af8 [6];
  bool _kj_shouldLog_49;
  bool _kj_shouldLog_48;
  StringPtr local_ae8;
  iterator local_ad8;
  undefined8 local_ad0;
  ArrayPtr<const_kj::StringPtr> local_ac8;
  ArrayPtr<kj::String> local_ab8;
  bool local_aa1;
  undefined1 local_aa0 [7];
  bool _kj_shouldLog_47;
  bool local_a8a;
  bool local_a89;
  undefined1 local_a88 [6];
  bool _kj_shouldLog_46;
  bool _kj_shouldLog_45;
  undefined2 local_a72;
  ArrayPtr<const_char> local_a70;
  ArrayPtr<const_char> local_a60;
  undefined1 local_a50 [8];
  Url url_6;
  undefined1 local_968 [7];
  bool _kj_shouldLog_44;
  String *local_958;
  Fault local_950;
  String *local_948;
  String *_kj_result;
  undefined1 local_938 [6];
  bool _kj_shouldLog_43;
  bool _kj_shouldLog_42;
  bool local_921;
  undefined1 local_920 [7];
  bool _kj_shouldLog_41;
  bool local_909;
  undefined1 local_908 [7];
  bool _kj_shouldLog_40;
  Fault local_8f8;
  Fault f;
  undefined1 local_8e8 [6];
  bool _kj_shouldLog_39;
  bool _kj_shouldLog_38;
  StringPtr local_8d8;
  iterator local_8c8;
  undefined8 local_8c0;
  ArrayPtr<const_kj::StringPtr> local_8b8;
  ArrayPtr<kj::String> local_8a8;
  bool local_891;
  undefined1 local_890 [7];
  bool _kj_shouldLog_37;
  bool local_87a;
  bool local_879;
  undefined1 local_878 [6];
  bool _kj_shouldLog_36;
  bool _kj_shouldLog_35;
  undefined2 local_862;
  ArrayPtr<const_char> local_860;
  ArrayPtr<const_char> local_850;
  undefined1 local_840 [8];
  Url url_5;
  bool _kj_shouldLog_34;
  void *pvStack_758;
  bool _kj_shouldLog_33;
  bool local_74a;
  bool local_749;
  undefined1 local_748 [6];
  bool _kj_shouldLog_32;
  bool _kj_shouldLog_31;
  StringPtr local_738;
  iterator local_728;
  undefined8 local_720;
  ArrayPtr<const_kj::StringPtr> local_718;
  ArrayPtr<kj::String> local_708;
  bool local_6f1;
  undefined1 local_6f0 [7];
  bool _kj_shouldLog_30;
  bool local_6da;
  bool local_6d9;
  undefined1 local_6d8 [6];
  bool _kj_shouldLog_29;
  bool _kj_shouldLog_28;
  undefined2 local_6c2;
  ArrayPtr<const_char> local_6c0;
  ArrayPtr<const_char> local_6b0;
  undefined1 local_6a0 [8];
  Url url_4;
  bool _kj_shouldLog_27;
  void *pvStack_5b8;
  bool _kj_shouldLog_26;
  bool local_5aa;
  bool local_5a9;
  undefined1 local_5a8 [6];
  bool _kj_shouldLog_25;
  bool _kj_shouldLog_24;
  StringPtr local_598;
  iterator local_588;
  undefined8 local_580;
  ArrayPtr<const_kj::StringPtr> local_578;
  ArrayPtr<kj::String> local_568;
  bool local_551;
  undefined1 local_550 [7];
  bool _kj_shouldLog_23;
  bool local_53a;
  bool local_539;
  undefined1 local_538 [6];
  bool _kj_shouldLog_22;
  bool _kj_shouldLog_21;
  undefined2 local_522;
  ArrayPtr<const_char> local_520;
  ArrayPtr<const_char> local_510;
  undefined1 local_500 [8];
  Url url_3;
  bool _kj_shouldLog_20;
  void *pvStack_418;
  bool _kj_shouldLog_19;
  bool local_40a;
  bool local_409;
  bool _kj_shouldLog_18;
  void *pvStack_408;
  bool _kj_shouldLog_17;
  bool local_3f9;
  undefined1 local_3f8 [7];
  bool _kj_shouldLog_16;
  bool local_3e2;
  bool local_3e1;
  undefined1 local_3e0 [6];
  bool _kj_shouldLog_15;
  bool _kj_shouldLog_14;
  undefined2 local_3ca;
  ArrayPtr<const_char> local_3c8;
  ArrayPtr<const_char> local_3b8;
  undefined1 local_3a8 [8];
  Url url_2;
  bool _kj_shouldLog_13;
  void *pvStack_2c0;
  bool _kj_shouldLog_12;
  bool local_2b2;
  bool local_2b1;
  bool _kj_shouldLog_11;
  void *pvStack_2b0;
  bool _kj_shouldLog_10;
  bool local_2a1;
  undefined1 local_2a0 [7];
  bool _kj_shouldLog_9;
  bool local_28a;
  bool local_289;
  undefined1 local_288 [6];
  bool _kj_shouldLog_8;
  bool _kj_shouldLog_7;
  undefined2 local_272;
  ArrayPtr<const_char> local_270;
  ArrayPtr<const_char> local_260;
  undefined1 local_250 [8];
  Url url_1;
  bool _kj_shouldLog_6;
  void *pvStack_168;
  bool _kj_shouldLog_5;
  bool local_15a;
  bool local_159;
  bool _kj_shouldLog_4;
  void *pvStack_158;
  bool _kj_shouldLog_3;
  bool local_149;
  undefined1 local_148 [7];
  bool _kj_shouldLog_2;
  bool local_136;
  bool local_135;
  bool _kj_shouldLog_1;
  bool _kj_shouldLog;
  StringPtr local_128;
  undefined2 local_112;
  ArrayPtr<const_char> local_110;
  ArrayPtr<const_char> local_100;
  undefined1 local_f0 [8];
  Url url;
  TestCase50 *this_local;
  
  url._216_8_ = this;
  StringPtr::StringPtr((StringPtr *)&local_100,"https://capnproto.org");
  StringPtr::StringPtr((StringPtr *)&local_110,(void *)0x0);
  local_112 = 1;
  parseAndCheck((Url *)local_f0,(StringPtr)local_100,(StringPtr)local_110,(Options)0x1);
  StringPtr::StringPtr(&local_128,"https");
  bVar3 = String::operator==((String *)local_f0,&local_128);
  if (!bVar3) {
    local_135 = _::Debug::shouldLog(ERROR);
    while (local_135 != false) {
      _::Debug::log<char_const(&)[39]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x35,ERROR,"\"failed: expected \" \"url.scheme == \\\"https\\\"\"",
                 (char (*) [39])"failed: expected url.scheme == \"https\"");
      local_135 = false;
    }
  }
  bVar3 = Maybe<kj::Url::UserInfo>::operator==
                    ((Maybe<kj::Url::UserInfo> *)&url.scheme.content.disposer,(void *)0x0);
  if (!bVar3) {
    local_136 = _::Debug::shouldLog(ERROR);
    while (local_136 != false) {
      _::Debug::log<char_const(&)[41]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x36,ERROR,"\"failed: expected \" \"url.userInfo == nullptr\"",
                 (char (*) [41])"failed: expected url.userInfo == nullptr");
      local_136 = false;
    }
  }
  StringPtr::StringPtr((StringPtr *)local_148,"capnproto.org");
  bVar3 = String::operator==((String *)
                             ((long)&url.userInfo.ptr.field_1.value.password.ptr.field_1 + 0x10),
                             (StringPtr *)local_148);
  if (!bVar3) {
    local_149 = _::Debug::shouldLog(ERROR);
    while (local_149 != false) {
      _::Debug::log<char_const(&)[45]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x37,ERROR,"\"failed: expected \" \"url.host == \\\"capnproto.org\\\"\"",
                 (char (*) [45])"failed: expected url.host == \"capnproto.org\"");
      local_149 = false;
    }
  }
  pvStack_158 = (void *)0x0;
  bVar3 = Vector<kj::String>::operator==
                    ((Vector<kj::String> *)&url.host.content.disposer,&stack0xfffffffffffffea8);
  if (!bVar3) {
    local_159 = _::Debug::shouldLog(ERROR);
    while (local_159 != false) {
      _::Debug::log<char_const(&)[37]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x38,ERROR,"\"failed: expected \" \"url.path == nullptr\"",
                 (char (*) [37])"failed: expected url.path == nullptr");
      local_159 = false;
    }
  }
  if (((byte)url.path.builder.disposer & 1) != 0) {
    local_15a = _::Debug::shouldLog(ERROR);
    while (local_15a != false) {
      _::Debug::log<char_const(&)[39]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x39,ERROR,"\"failed: expected \" \"!url.hasTrailingSlash\"",
                 (char (*) [39])"failed: expected !url.hasTrailingSlash");
      local_15a = false;
    }
  }
  pvStack_168 = (void *)0x0;
  bVar3 = Vector<kj::Url::QueryParam>::operator==
                    ((Vector<kj::Url::QueryParam> *)&url.hasTrailingSlash,&stack0xfffffffffffffe98);
  if (!bVar3) {
    url_1._223_1_ = _::Debug::shouldLog(ERROR);
    while (url_1._223_1_ != '\0') {
      _::Debug::log<char_const(&)[38]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x3a,ERROR,"\"failed: expected \" \"url.query == nullptr\"",
                 (char (*) [38])"failed: expected url.query == nullptr");
      url_1._223_1_ = 0;
    }
  }
  bVar3 = Maybe<kj::String>::operator==
                    ((Maybe<kj::String> *)&url.query.builder.disposer,(void *)0x0);
  if (!bVar3) {
    url_1._222_1_ = _::Debug::shouldLog(ERROR);
    while (url_1._222_1_ != '\0') {
      _::Debug::log<char_const(&)[41]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x3b,ERROR,"\"failed: expected \" \"url.fragment == nullptr\"",
                 (char (*) [41])"failed: expected url.fragment == nullptr");
      url_1._222_1_ = 0;
    }
  }
  Url::~Url((Url *)local_f0);
  StringPtr::StringPtr((StringPtr *)&local_260,"https://capnproto.org:80");
  StringPtr::StringPtr((StringPtr *)&local_270,(void *)0x0);
  local_272 = 1;
  parseAndCheck((Url *)local_250,(StringPtr)local_260,(StringPtr)local_270,(Options)0x1);
  StringPtr::StringPtr((StringPtr *)local_288,"https");
  bVar3 = String::operator==((String *)local_250,(StringPtr *)local_288);
  if (!bVar3) {
    local_289 = _::Debug::shouldLog(ERROR);
    while (local_289 != false) {
      _::Debug::log<char_const(&)[39]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x40,ERROR,"\"failed: expected \" \"url.scheme == \\\"https\\\"\"",
                 (char (*) [39])"failed: expected url.scheme == \"https\"");
      local_289 = false;
    }
  }
  bVar3 = Maybe<kj::Url::UserInfo>::operator==
                    ((Maybe<kj::Url::UserInfo> *)&url_1.scheme.content.disposer,(void *)0x0);
  if (!bVar3) {
    local_28a = _::Debug::shouldLog(ERROR);
    while (local_28a != false) {
      _::Debug::log<char_const(&)[41]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x41,ERROR,"\"failed: expected \" \"url.userInfo == nullptr\"",
                 (char (*) [41])"failed: expected url.userInfo == nullptr");
      local_28a = false;
    }
  }
  StringPtr::StringPtr((StringPtr *)local_2a0,"capnproto.org:80");
  bVar3 = String::operator==((String *)
                             ((long)&url_1.userInfo.ptr.field_1.value.password.ptr.field_1 + 0x10),
                             (StringPtr *)local_2a0);
  if (!bVar3) {
    local_2a1 = _::Debug::shouldLog(ERROR);
    while (local_2a1 != false) {
      _::Debug::log<char_const(&)[48]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x42,ERROR,"\"failed: expected \" \"url.host == \\\"capnproto.org:80\\\"\"",
                 (char (*) [48])"failed: expected url.host == \"capnproto.org:80\"");
      local_2a1 = false;
    }
  }
  pvStack_2b0 = (void *)0x0;
  bVar3 = Vector<kj::String>::operator==
                    ((Vector<kj::String> *)&url_1.host.content.disposer,&stack0xfffffffffffffd50);
  if (!bVar3) {
    local_2b1 = _::Debug::shouldLog(ERROR);
    while (local_2b1 != false) {
      _::Debug::log<char_const(&)[37]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x43,ERROR,"\"failed: expected \" \"url.path == nullptr\"",
                 (char (*) [37])"failed: expected url.path == nullptr");
      local_2b1 = false;
    }
  }
  if (((byte)url_1.path.builder.disposer & 1) != 0) {
    local_2b2 = _::Debug::shouldLog(ERROR);
    while (local_2b2 != false) {
      _::Debug::log<char_const(&)[39]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x44,ERROR,"\"failed: expected \" \"!url.hasTrailingSlash\"",
                 (char (*) [39])"failed: expected !url.hasTrailingSlash");
      local_2b2 = false;
    }
  }
  pvStack_2c0 = (void *)0x0;
  bVar3 = Vector<kj::Url::QueryParam>::operator==
                    ((Vector<kj::Url::QueryParam> *)&url_1.hasTrailingSlash,&stack0xfffffffffffffd40
                    );
  if (!bVar3) {
    url_2._223_1_ = _::Debug::shouldLog(ERROR);
    while (url_2._223_1_ != '\0') {
      _::Debug::log<char_const(&)[38]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x45,ERROR,"\"failed: expected \" \"url.query == nullptr\"",
                 (char (*) [38])"failed: expected url.query == nullptr");
      url_2._223_1_ = 0;
    }
  }
  bVar3 = Maybe<kj::String>::operator==
                    ((Maybe<kj::String> *)&url_1.query.builder.disposer,(void *)0x0);
  if (!bVar3) {
    url_2._222_1_ = _::Debug::shouldLog(ERROR);
    while (url_2._222_1_ != '\0') {
      _::Debug::log<char_const(&)[41]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x46,ERROR,"\"failed: expected \" \"url.fragment == nullptr\"",
                 (char (*) [41])"failed: expected url.fragment == nullptr");
      url_2._222_1_ = 0;
    }
  }
  Url::~Url((Url *)local_250);
  StringPtr::StringPtr((StringPtr *)&local_3b8,"https://capnproto.org/");
  StringPtr::StringPtr((StringPtr *)&local_3c8,(void *)0x0);
  local_3ca = 1;
  parseAndCheck((Url *)local_3a8,(StringPtr)local_3b8,(StringPtr)local_3c8,(Options)0x1);
  StringPtr::StringPtr((StringPtr *)local_3e0,"https");
  bVar3 = String::operator==((String *)local_3a8,(StringPtr *)local_3e0);
  if (!bVar3) {
    local_3e1 = _::Debug::shouldLog(ERROR);
    while (local_3e1 != false) {
      _::Debug::log<char_const(&)[39]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x4b,ERROR,"\"failed: expected \" \"url.scheme == \\\"https\\\"\"",
                 (char (*) [39])"failed: expected url.scheme == \"https\"");
      local_3e1 = false;
    }
  }
  bVar3 = Maybe<kj::Url::UserInfo>::operator==
                    ((Maybe<kj::Url::UserInfo> *)&url_2.scheme.content.disposer,(void *)0x0);
  if (!bVar3) {
    local_3e2 = _::Debug::shouldLog(ERROR);
    while (local_3e2 != false) {
      _::Debug::log<char_const(&)[41]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x4c,ERROR,"\"failed: expected \" \"url.userInfo == nullptr\"",
                 (char (*) [41])"failed: expected url.userInfo == nullptr");
      local_3e2 = false;
    }
  }
  StringPtr::StringPtr((StringPtr *)local_3f8,"capnproto.org");
  bVar3 = String::operator==((String *)
                             ((long)&url_2.userInfo.ptr.field_1.value.password.ptr.field_1 + 0x10),
                             (StringPtr *)local_3f8);
  if (!bVar3) {
    local_3f9 = _::Debug::shouldLog(ERROR);
    while (local_3f9 != false) {
      _::Debug::log<char_const(&)[45]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x4d,ERROR,"\"failed: expected \" \"url.host == \\\"capnproto.org\\\"\"",
                 (char (*) [45])"failed: expected url.host == \"capnproto.org\"");
      local_3f9 = false;
    }
  }
  pvStack_408 = (void *)0x0;
  bVar3 = Vector<kj::String>::operator==
                    ((Vector<kj::String> *)&url_2.host.content.disposer,&stack0xfffffffffffffbf8);
  if (!bVar3) {
    local_409 = _::Debug::shouldLog(ERROR);
    while (local_409 != false) {
      _::Debug::log<char_const(&)[37]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x4e,ERROR,"\"failed: expected \" \"url.path == nullptr\"",
                 (char (*) [37])"failed: expected url.path == nullptr");
      local_409 = false;
    }
  }
  if (((byte)url_2.path.builder.disposer & 1) == 0) {
    local_40a = _::Debug::shouldLog(ERROR);
    while (local_40a != false) {
      _::Debug::log<char_const(&)[38]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x4f,ERROR,"\"failed: expected \" \"url.hasTrailingSlash\"",
                 (char (*) [38])"failed: expected url.hasTrailingSlash");
      local_40a = false;
    }
  }
  pvStack_418 = (void *)0x0;
  bVar3 = Vector<kj::Url::QueryParam>::operator==
                    ((Vector<kj::Url::QueryParam> *)&url_2.hasTrailingSlash,&stack0xfffffffffffffbe8
                    );
  if (!bVar3) {
    url_3._223_1_ = _::Debug::shouldLog(ERROR);
    while (url_3._223_1_ != '\0') {
      _::Debug::log<char_const(&)[38]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x50,ERROR,"\"failed: expected \" \"url.query == nullptr\"",
                 (char (*) [38])"failed: expected url.query == nullptr");
      url_3._223_1_ = 0;
    }
  }
  bVar3 = Maybe<kj::String>::operator==
                    ((Maybe<kj::String> *)&url_2.query.builder.disposer,(void *)0x0);
  if (!bVar3) {
    url_3._222_1_ = _::Debug::shouldLog(ERROR);
    while (url_3._222_1_ != '\0') {
      _::Debug::log<char_const(&)[41]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x51,ERROR,"\"failed: expected \" \"url.fragment == nullptr\"",
                 (char (*) [41])"failed: expected url.fragment == nullptr");
      url_3._222_1_ = 0;
    }
  }
  Url::~Url((Url *)local_3a8);
  StringPtr::StringPtr((StringPtr *)&local_510,"https://capnproto.org/foo/bar");
  StringPtr::StringPtr((StringPtr *)&local_520,(void *)0x0);
  local_522 = 1;
  parseAndCheck((Url *)local_500,(StringPtr)local_510,(StringPtr)local_520,(Options)0x1);
  StringPtr::StringPtr((StringPtr *)local_538,"https");
  bVar3 = String::operator==((String *)local_500,(StringPtr *)local_538);
  if (!bVar3) {
    local_539 = _::Debug::shouldLog(ERROR);
    while (local_539 != false) {
      _::Debug::log<char_const(&)[39]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x56,ERROR,"\"failed: expected \" \"url.scheme == \\\"https\\\"\"",
                 (char (*) [39])"failed: expected url.scheme == \"https\"");
      local_539 = false;
    }
  }
  bVar3 = Maybe<kj::Url::UserInfo>::operator==
                    ((Maybe<kj::Url::UserInfo> *)&url_3.scheme.content.disposer,(void *)0x0);
  if (!bVar3) {
    local_53a = _::Debug::shouldLog(ERROR);
    while (local_53a != false) {
      _::Debug::log<char_const(&)[41]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x57,ERROR,"\"failed: expected \" \"url.userInfo == nullptr\"",
                 (char (*) [41])"failed: expected url.userInfo == nullptr");
      local_53a = false;
    }
  }
  StringPtr::StringPtr((StringPtr *)local_550,"capnproto.org");
  bVar3 = String::operator==((String *)
                             ((long)&url_3.userInfo.ptr.field_1.value.password.ptr.field_1 + 0x10),
                             (StringPtr *)local_550);
  if (!bVar3) {
    local_551 = _::Debug::shouldLog(ERROR);
    while (local_551 != false) {
      _::Debug::log<char_const(&)[45]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x58,ERROR,"\"failed: expected \" \"url.host == \\\"capnproto.org\\\"\"",
                 (char (*) [45])"failed: expected url.host == \"capnproto.org\"");
      local_551 = false;
    }
  }
  local_568 = Vector<kj::String>::asPtr((Vector<kj::String> *)&url_3.host.content.disposer);
  StringPtr::StringPtr((StringPtr *)local_5a8,"foo");
  StringPtr::StringPtr(&local_598,"bar");
  local_588 = (iterator)local_5a8;
  local_580 = 2;
  init_09._M_len = 2;
  init_09._M_array = local_588;
  ArrayPtr<const_kj::StringPtr>::ArrayPtr(&local_578,init_09);
  bVar3 = ArrayPtr<kj::String>::operator==(&local_568,&local_578);
  if (!bVar3) {
    local_5a9 = _::Debug::shouldLog(ERROR);
    while (local_5a9 != false) {
      _::Debug::log<char_const(&)[83]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x59,ERROR,
                 "\"failed: expected \" \"url.path.asPtr() == kj::ArrayPtr<const StringPtr>({\\\"foo\\\", \\\"bar\\\"})\""
                 ,(char (*) [83])
                  "failed: expected url.path.asPtr() == kj::ArrayPtr<const StringPtr>({\"foo\", \"bar\"})"
                );
      local_5a9 = false;
    }
  }
  if (((byte)url_3.path.builder.disposer & 1) != 0) {
    local_5aa = _::Debug::shouldLog(ERROR);
    while (local_5aa != false) {
      _::Debug::log<char_const(&)[39]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x5a,ERROR,"\"failed: expected \" \"!url.hasTrailingSlash\"",
                 (char (*) [39])"failed: expected !url.hasTrailingSlash");
      local_5aa = false;
    }
  }
  pvStack_5b8 = (void *)0x0;
  bVar3 = Vector<kj::Url::QueryParam>::operator==
                    ((Vector<kj::Url::QueryParam> *)&url_3.hasTrailingSlash,&stack0xfffffffffffffa48
                    );
  if (!bVar3) {
    url_4._223_1_ = _::Debug::shouldLog(ERROR);
    while (url_4._223_1_ != '\0') {
      _::Debug::log<char_const(&)[38]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x5b,ERROR,"\"failed: expected \" \"url.query == nullptr\"",
                 (char (*) [38])"failed: expected url.query == nullptr");
      url_4._223_1_ = 0;
    }
  }
  bVar3 = Maybe<kj::String>::operator==
                    ((Maybe<kj::String> *)&url_3.query.builder.disposer,(void *)0x0);
  if (!bVar3) {
    url_4._222_1_ = _::Debug::shouldLog(ERROR);
    while (url_4._222_1_ != '\0') {
      _::Debug::log<char_const(&)[41]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x5c,ERROR,"\"failed: expected \" \"url.fragment == nullptr\"",
                 (char (*) [41])"failed: expected url.fragment == nullptr");
      url_4._222_1_ = 0;
    }
  }
  Url::~Url((Url *)local_500);
  StringPtr::StringPtr((StringPtr *)&local_6b0,"https://capnproto.org/foo/bar/");
  StringPtr::StringPtr((StringPtr *)&local_6c0,(void *)0x0);
  local_6c2 = 1;
  parseAndCheck((Url *)local_6a0,(StringPtr)local_6b0,(StringPtr)local_6c0,(Options)0x1);
  StringPtr::StringPtr((StringPtr *)local_6d8,"https");
  bVar3 = String::operator==((String *)local_6a0,(StringPtr *)local_6d8);
  if (!bVar3) {
    local_6d9 = _::Debug::shouldLog(ERROR);
    while (local_6d9 != false) {
      _::Debug::log<char_const(&)[39]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x61,ERROR,"\"failed: expected \" \"url.scheme == \\\"https\\\"\"",
                 (char (*) [39])"failed: expected url.scheme == \"https\"");
      local_6d9 = false;
    }
  }
  bVar3 = Maybe<kj::Url::UserInfo>::operator==
                    ((Maybe<kj::Url::UserInfo> *)&url_4.scheme.content.disposer,(void *)0x0);
  if (!bVar3) {
    local_6da = _::Debug::shouldLog(ERROR);
    while (local_6da != false) {
      _::Debug::log<char_const(&)[41]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x62,ERROR,"\"failed: expected \" \"url.userInfo == nullptr\"",
                 (char (*) [41])"failed: expected url.userInfo == nullptr");
      local_6da = false;
    }
  }
  StringPtr::StringPtr((StringPtr *)local_6f0,"capnproto.org");
  bVar3 = String::operator==((String *)
                             ((long)&url_4.userInfo.ptr.field_1.value.password.ptr.field_1 + 0x10),
                             (StringPtr *)local_6f0);
  if (!bVar3) {
    local_6f1 = _::Debug::shouldLog(ERROR);
    while (local_6f1 != false) {
      _::Debug::log<char_const(&)[45]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,99,ERROR,"\"failed: expected \" \"url.host == \\\"capnproto.org\\\"\"",
                 (char (*) [45])"failed: expected url.host == \"capnproto.org\"");
      local_6f1 = false;
    }
  }
  local_708 = Vector<kj::String>::asPtr((Vector<kj::String> *)&url_4.host.content.disposer);
  StringPtr::StringPtr((StringPtr *)local_748,"foo");
  StringPtr::StringPtr(&local_738,"bar");
  local_728 = (iterator)local_748;
  local_720 = 2;
  init_08._M_len = 2;
  init_08._M_array = local_728;
  ArrayPtr<const_kj::StringPtr>::ArrayPtr(&local_718,init_08);
  bVar3 = ArrayPtr<kj::String>::operator==(&local_708,&local_718);
  if (!bVar3) {
    local_749 = _::Debug::shouldLog(ERROR);
    while (local_749 != false) {
      _::Debug::log<char_const(&)[83]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,100,ERROR,
                 "\"failed: expected \" \"url.path.asPtr() == kj::ArrayPtr<const StringPtr>({\\\"foo\\\", \\\"bar\\\"})\""
                 ,(char (*) [83])
                  "failed: expected url.path.asPtr() == kj::ArrayPtr<const StringPtr>({\"foo\", \"bar\"})"
                );
      local_749 = false;
    }
  }
  if (((byte)url_4.path.builder.disposer & 1) == 0) {
    local_74a = _::Debug::shouldLog(ERROR);
    while (local_74a != false) {
      _::Debug::log<char_const(&)[38]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x65,ERROR,"\"failed: expected \" \"url.hasTrailingSlash\"",
                 (char (*) [38])"failed: expected url.hasTrailingSlash");
      local_74a = false;
    }
  }
  pvStack_758 = (void *)0x0;
  bVar3 = Vector<kj::Url::QueryParam>::operator==
                    ((Vector<kj::Url::QueryParam> *)&url_4.hasTrailingSlash,&stack0xfffffffffffff8a8
                    );
  if (!bVar3) {
    url_5._223_1_ = _::Debug::shouldLog(ERROR);
    while (url_5._223_1_ != '\0') {
      _::Debug::log<char_const(&)[38]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x66,ERROR,"\"failed: expected \" \"url.query == nullptr\"",
                 (char (*) [38])"failed: expected url.query == nullptr");
      url_5._223_1_ = 0;
    }
  }
  bVar3 = Maybe<kj::String>::operator==
                    ((Maybe<kj::String> *)&url_4.query.builder.disposer,(void *)0x0);
  if (!bVar3) {
    url_5._222_1_ = _::Debug::shouldLog(ERROR);
    while (url_5._222_1_ != '\0') {
      _::Debug::log<char_const(&)[41]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x67,ERROR,"\"failed: expected \" \"url.fragment == nullptr\"",
                 (char (*) [41])"failed: expected url.fragment == nullptr");
      url_5._222_1_ = 0;
    }
  }
  Url::~Url((Url *)local_6a0);
  StringPtr::StringPtr((StringPtr *)&local_850,"https://capnproto.org/foo/bar?baz=qux&corge#garply")
  ;
  StringPtr::StringPtr((StringPtr *)&local_860,(void *)0x0);
  local_862 = 1;
  parseAndCheck((Url *)local_840,(StringPtr)local_850,(StringPtr)local_860,(Options)0x1);
  StringPtr::StringPtr((StringPtr *)local_878,"https");
  bVar3 = String::operator==((String *)local_840,(StringPtr *)local_878);
  if (!bVar3) {
    local_879 = _::Debug::shouldLog(ERROR);
    while (local_879 != false) {
      _::Debug::log<char_const(&)[39]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x6c,ERROR,"\"failed: expected \" \"url.scheme == \\\"https\\\"\"",
                 (char (*) [39])"failed: expected url.scheme == \"https\"");
      local_879 = false;
    }
  }
  bVar3 = Maybe<kj::Url::UserInfo>::operator==
                    ((Maybe<kj::Url::UserInfo> *)&url_5.scheme.content.disposer,(void *)0x0);
  if (!bVar3) {
    local_87a = _::Debug::shouldLog(ERROR);
    while (local_87a != false) {
      _::Debug::log<char_const(&)[41]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x6d,ERROR,"\"failed: expected \" \"url.userInfo == nullptr\"",
                 (char (*) [41])"failed: expected url.userInfo == nullptr");
      local_87a = false;
    }
  }
  StringPtr::StringPtr((StringPtr *)local_890,"capnproto.org");
  bVar3 = String::operator==((String *)
                             ((long)&url_5.userInfo.ptr.field_1.value.password.ptr.field_1 + 0x10),
                             (StringPtr *)local_890);
  if (!bVar3) {
    local_891 = _::Debug::shouldLog(ERROR);
    while (local_891 != false) {
      _::Debug::log<char_const(&)[45]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x6e,ERROR,"\"failed: expected \" \"url.host == \\\"capnproto.org\\\"\"",
                 (char (*) [45])"failed: expected url.host == \"capnproto.org\"");
      local_891 = false;
    }
  }
  local_8a8 = Vector<kj::String>::asPtr((Vector<kj::String> *)&url_5.host.content.disposer);
  StringPtr::StringPtr((StringPtr *)local_8e8,"foo");
  StringPtr::StringPtr(&local_8d8,"bar");
  local_8c8 = (iterator)local_8e8;
  local_8c0 = 2;
  init_07._M_len = 2;
  init_07._M_array = local_8c8;
  ArrayPtr<const_kj::StringPtr>::ArrayPtr(&local_8b8,init_07);
  bVar3 = ArrayPtr<kj::String>::operator==(&local_8a8,&local_8b8);
  if (!bVar3) {
    f.exception._7_1_ = _::Debug::shouldLog(ERROR);
    while ((bool)f.exception._7_1_ != false) {
      _::Debug::log<char_const(&)[83]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x6f,ERROR,
                 "\"failed: expected \" \"url.path.asPtr() == kj::ArrayPtr<const StringPtr>({\\\"foo\\\", \\\"bar\\\"})\""
                 ,(char (*) [83])
                  "failed: expected url.path.asPtr() == kj::ArrayPtr<const StringPtr>({\"foo\", \"bar\"})"
                );
      f.exception._7_1_ = false;
    }
  }
  if (((byte)url_5.path.builder.disposer & 1) != 0) {
    f.exception._6_1_ = _::Debug::shouldLog(ERROR);
    while ((bool)f.exception._6_1_ != false) {
      _::Debug::log<char_const(&)[39]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x70,ERROR,"\"failed: expected \" \"!url.hasTrailingSlash\"",
                 (char (*) [39])"failed: expected !url.hasTrailingSlash");
      f.exception._6_1_ = false;
    }
  }
  sVar4 = Vector<kj::Url::QueryParam>::size((Vector<kj::Url::QueryParam> *)&url_5.hasTrailingSlash);
  if (sVar4 != 2) {
    _::Debug::Fault::Fault
              (&local_8f8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x71,FAILED,"url.query.size() == 2","");
    _::Debug::Fault::fatal(&local_8f8);
  }
  pQVar5 = Vector<kj::Url::QueryParam>::operator[]
                     ((Vector<kj::Url::QueryParam> *)&url_5.hasTrailingSlash,0);
  StringPtr::StringPtr((StringPtr *)local_908,"baz");
  bVar3 = String::operator==(&pQVar5->name,(StringPtr *)local_908);
  if (!bVar3) {
    local_909 = _::Debug::shouldLog(ERROR);
    while (local_909 != false) {
      _::Debug::log<char_const(&)[44]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x72,ERROR,"\"failed: expected \" \"url.query[0].name == \\\"baz\\\"\"",
                 (char (*) [44])"failed: expected url.query[0].name == \"baz\"");
      local_909 = false;
    }
  }
  pQVar5 = Vector<kj::Url::QueryParam>::operator[]
                     ((Vector<kj::Url::QueryParam> *)&url_5.hasTrailingSlash,0);
  StringPtr::StringPtr((StringPtr *)local_920,"qux");
  bVar3 = String::operator==(&pQVar5->value,(StringPtr *)local_920);
  if (!bVar3) {
    local_921 = _::Debug::shouldLog(ERROR);
    while (local_921 != false) {
      _::Debug::log<char_const(&)[45]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x73,ERROR,"\"failed: expected \" \"url.query[0].value == \\\"qux\\\"\"",
                 (char (*) [45])"failed: expected url.query[0].value == \"qux\"");
      local_921 = false;
    }
  }
  pQVar5 = Vector<kj::Url::QueryParam>::operator[]
                     ((Vector<kj::Url::QueryParam> *)&url_5.hasTrailingSlash,1);
  StringPtr::StringPtr((StringPtr *)local_938,"corge");
  bVar3 = String::operator==(&pQVar5->name,(StringPtr *)local_938);
  if (!bVar3) {
    _kj_result._7_1_ = _::Debug::shouldLog(ERROR);
    while ((bool)_kj_result._7_1_ != false) {
      _::Debug::log<char_const(&)[46]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x74,ERROR,"\"failed: expected \" \"url.query[1].name == \\\"corge\\\"\"",
                 (char (*) [46])"failed: expected url.query[1].name == \"corge\"");
      _kj_result._7_1_ = false;
    }
  }
  pQVar5 = Vector<kj::Url::QueryParam>::operator[]
                     ((Vector<kj::Url::QueryParam> *)&url_5.hasTrailingSlash,1);
  bVar3 = String::operator==(&pQVar5->value,(void *)0x0);
  if (!bVar3) {
    _kj_result._6_1_ = _::Debug::shouldLog(ERROR);
    while ((bool)_kj_result._6_1_ != false) {
      _::Debug::log<char_const(&)[47]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x75,ERROR,"\"failed: expected \" \"url.query[1].value == nullptr\"",
                 (char (*) [47])"failed: expected url.query[1].value == nullptr");
      _kj_result._6_1_ = false;
    }
  }
  local_948 = _::readMaybe<kj::String>((Maybe<kj::String> *)&url_5.query.builder.disposer);
  if (local_948 == (String *)0x0) {
    _::Debug::Fault::Fault
              (&local_950,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x76,FAILED,"url.fragment != nullptr","");
    _::Debug::Fault::fatal(&local_950);
  }
  ppSVar6 = mv<kj::String*>(&local_948);
  pSVar1 = *ppSVar6;
  local_958 = pSVar1;
  StringPtr::StringPtr((StringPtr *)local_968,"garply");
  bVar3 = String::operator==(pSVar1,(StringPtr *)local_968);
  if (!bVar3) {
    url_6._223_1_ = _::Debug::shouldLog(ERROR);
    while (url_6._223_1_ != '\0') {
      _::Debug::log<char_const(&)[61]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x76,ERROR,
                 "\"failed: expected \" \"KJ_ASSERT_NONNULL(url.fragment) == \\\"garply\\\"\"",
                 (char (*) [61])"failed: expected KJ_ASSERT_NONNULL(url.fragment) == \"garply\"");
      url_6._223_1_ = 0;
    }
  }
  Url::~Url((Url *)local_840);
  StringPtr::StringPtr
            ((StringPtr *)&local_a60,"https://capnproto.org/foo/bar?baz=qux&corge=#garply");
  StringPtr::StringPtr((StringPtr *)&local_a70,(void *)0x0);
  local_a72 = 1;
  parseAndCheck((Url *)local_a50,(StringPtr)local_a60,(StringPtr)local_a70,(Options)0x1);
  StringPtr::StringPtr((StringPtr *)local_a88,"https");
  bVar3 = String::operator==((String *)local_a50,(StringPtr *)local_a88);
  if (!bVar3) {
    local_a89 = _::Debug::shouldLog(ERROR);
    while (local_a89 != false) {
      _::Debug::log<char_const(&)[39]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x7b,ERROR,"\"failed: expected \" \"url.scheme == \\\"https\\\"\"",
                 (char (*) [39])"failed: expected url.scheme == \"https\"");
      local_a89 = false;
    }
  }
  bVar3 = Maybe<kj::Url::UserInfo>::operator==
                    ((Maybe<kj::Url::UserInfo> *)&url_6.scheme.content.disposer,(void *)0x0);
  if (!bVar3) {
    local_a8a = _::Debug::shouldLog(ERROR);
    while (local_a8a != false) {
      _::Debug::log<char_const(&)[41]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x7c,ERROR,"\"failed: expected \" \"url.userInfo == nullptr\"",
                 (char (*) [41])"failed: expected url.userInfo == nullptr");
      local_a8a = false;
    }
  }
  StringPtr::StringPtr((StringPtr *)local_aa0,"capnproto.org");
  bVar3 = String::operator==((String *)
                             ((long)&url_6.userInfo.ptr.field_1.value.password.ptr.field_1 + 0x10),
                             (StringPtr *)local_aa0);
  if (!bVar3) {
    local_aa1 = _::Debug::shouldLog(ERROR);
    while (local_aa1 != false) {
      _::Debug::log<char_const(&)[45]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x7d,ERROR,"\"failed: expected \" \"url.host == \\\"capnproto.org\\\"\"",
                 (char (*) [45])"failed: expected url.host == \"capnproto.org\"");
      local_aa1 = false;
    }
  }
  local_ab8 = Vector<kj::String>::asPtr((Vector<kj::String> *)&url_6.host.content.disposer);
  StringPtr::StringPtr((StringPtr *)local_af8,"foo");
  StringPtr::StringPtr(&local_ae8,"bar");
  local_ad8 = (iterator)local_af8;
  local_ad0 = 2;
  init_06._M_len = 2;
  init_06._M_array = local_ad8;
  ArrayPtr<const_kj::StringPtr>::ArrayPtr(&local_ac8,init_06);
  bVar3 = ArrayPtr<kj::String>::operator==(&local_ab8,&local_ac8);
  if (!bVar3) {
    f_1.exception._7_1_ = _::Debug::shouldLog(ERROR);
    while ((bool)f_1.exception._7_1_ != false) {
      _::Debug::log<char_const(&)[83]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x7e,ERROR,
                 "\"failed: expected \" \"url.path.asPtr() == kj::ArrayPtr<const StringPtr>({\\\"foo\\\", \\\"bar\\\"})\""
                 ,(char (*) [83])
                  "failed: expected url.path.asPtr() == kj::ArrayPtr<const StringPtr>({\"foo\", \"bar\"})"
                );
      f_1.exception._7_1_ = false;
    }
  }
  if (((byte)url_6.path.builder.disposer & 1) != 0) {
    f_1.exception._6_1_ = _::Debug::shouldLog(ERROR);
    while ((bool)f_1.exception._6_1_ != false) {
      _::Debug::log<char_const(&)[39]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x7f,ERROR,"\"failed: expected \" \"!url.hasTrailingSlash\"",
                 (char (*) [39])"failed: expected !url.hasTrailingSlash");
      f_1.exception._6_1_ = false;
    }
  }
  sVar4 = Vector<kj::Url::QueryParam>::size((Vector<kj::Url::QueryParam> *)&url_6.hasTrailingSlash);
  if (sVar4 != 2) {
    _::Debug::Fault::Fault
              (&local_b08,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x80,FAILED,"url.query.size() == 2","");
    _::Debug::Fault::fatal(&local_b08);
  }
  pQVar5 = Vector<kj::Url::QueryParam>::operator[]
                     ((Vector<kj::Url::QueryParam> *)&url_6.hasTrailingSlash,0);
  StringPtr::StringPtr((StringPtr *)local_b18,"baz");
  bVar3 = String::operator==(&pQVar5->name,(StringPtr *)local_b18);
  if (!bVar3) {
    local_b19 = _::Debug::shouldLog(ERROR);
    while (local_b19 != false) {
      _::Debug::log<char_const(&)[44]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x81,ERROR,"\"failed: expected \" \"url.query[0].name == \\\"baz\\\"\"",
                 (char (*) [44])"failed: expected url.query[0].name == \"baz\"");
      local_b19 = false;
    }
  }
  pQVar5 = Vector<kj::Url::QueryParam>::operator[]
                     ((Vector<kj::Url::QueryParam> *)&url_6.hasTrailingSlash,0);
  StringPtr::StringPtr((StringPtr *)local_b30,"qux");
  bVar3 = String::operator==(&pQVar5->value,(StringPtr *)local_b30);
  if (!bVar3) {
    local_b31 = _::Debug::shouldLog(ERROR);
    while (local_b31 != false) {
      _::Debug::log<char_const(&)[45]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x82,ERROR,"\"failed: expected \" \"url.query[0].value == \\\"qux\\\"\"",
                 (char (*) [45])"failed: expected url.query[0].value == \"qux\"");
      local_b31 = false;
    }
  }
  pQVar5 = Vector<kj::Url::QueryParam>::operator[]
                     ((Vector<kj::Url::QueryParam> *)&url_6.hasTrailingSlash,1);
  StringPtr::StringPtr((StringPtr *)local_b48,"corge");
  bVar3 = String::operator==(&pQVar5->name,(StringPtr *)local_b48);
  if (!bVar3) {
    _kj_result_1._7_1_ = _::Debug::shouldLog(ERROR);
    while ((bool)_kj_result_1._7_1_ != false) {
      _::Debug::log<char_const(&)[46]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x83,ERROR,"\"failed: expected \" \"url.query[1].name == \\\"corge\\\"\"",
                 (char (*) [46])"failed: expected url.query[1].name == \"corge\"");
      _kj_result_1._7_1_ = false;
    }
  }
  pQVar5 = Vector<kj::Url::QueryParam>::operator[]
                     ((Vector<kj::Url::QueryParam> *)&url_6.hasTrailingSlash,1);
  bVar3 = String::operator==(&pQVar5->value,(void *)0x0);
  if (!bVar3) {
    _kj_result_1._6_1_ = _::Debug::shouldLog(ERROR);
    while ((bool)_kj_result_1._6_1_ != false) {
      _::Debug::log<char_const(&)[47]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x84,ERROR,"\"failed: expected \" \"url.query[1].value == nullptr\"",
                 (char (*) [47])"failed: expected url.query[1].value == nullptr");
      _kj_result_1._6_1_ = false;
    }
  }
  local_b58 = _::readMaybe<kj::String>((Maybe<kj::String> *)&url_6.query.builder.disposer);
  if (local_b58 == (String *)0x0) {
    _::Debug::Fault::Fault
              (&local_b60,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x85,FAILED,"url.fragment != nullptr","");
    _::Debug::Fault::fatal(&local_b60);
  }
  ppSVar6 = mv<kj::String*>(&local_b58);
  pSVar1 = *ppSVar6;
  local_b68 = pSVar1;
  StringPtr::StringPtr((StringPtr *)local_b78,"garply");
  bVar3 = String::operator==(pSVar1,(StringPtr *)local_b78);
  if (!bVar3) {
    url_7._223_1_ = _::Debug::shouldLog(ERROR);
    while (url_7._223_1_ != '\0') {
      _::Debug::log<char_const(&)[61]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x85,ERROR,
                 "\"failed: expected \" \"KJ_ASSERT_NONNULL(url.fragment) == \\\"garply\\\"\"",
                 (char (*) [61])"failed: expected KJ_ASSERT_NONNULL(url.fragment) == \"garply\"");
      url_7._223_1_ = 0;
    }
  }
  Url::~Url((Url *)local_a50);
  StringPtr::StringPtr
            ((StringPtr *)&local_c70,"https://capnproto.org/foo/bar?baz=&corge=grault#garply");
  StringPtr::StringPtr((StringPtr *)&local_c80,(void *)0x0);
  local_c82 = 1;
  parseAndCheck((Url *)local_c60,(StringPtr)local_c70,(StringPtr)local_c80,(Options)0x1);
  StringPtr::StringPtr((StringPtr *)local_c98,"https");
  bVar3 = String::operator==((String *)local_c60,(StringPtr *)local_c98);
  if (!bVar3) {
    local_c99 = _::Debug::shouldLog(ERROR);
    while (local_c99 != false) {
      _::Debug::log<char_const(&)[39]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x8a,ERROR,"\"failed: expected \" \"url.scheme == \\\"https\\\"\"",
                 (char (*) [39])"failed: expected url.scheme == \"https\"");
      local_c99 = false;
    }
  }
  bVar3 = Maybe<kj::Url::UserInfo>::operator==
                    ((Maybe<kj::Url::UserInfo> *)&url_7.scheme.content.disposer,(void *)0x0);
  if (!bVar3) {
    local_c9a = _::Debug::shouldLog(ERROR);
    while (local_c9a != false) {
      _::Debug::log<char_const(&)[41]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x8b,ERROR,"\"failed: expected \" \"url.userInfo == nullptr\"",
                 (char (*) [41])"failed: expected url.userInfo == nullptr");
      local_c9a = false;
    }
  }
  StringPtr::StringPtr((StringPtr *)local_cb0,"capnproto.org");
  bVar3 = String::operator==((String *)
                             ((long)&url_7.userInfo.ptr.field_1.value.password.ptr.field_1 + 0x10),
                             (StringPtr *)local_cb0);
  if (!bVar3) {
    local_cb1 = _::Debug::shouldLog(ERROR);
    while (local_cb1 != false) {
      _::Debug::log<char_const(&)[45]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x8c,ERROR,"\"failed: expected \" \"url.host == \\\"capnproto.org\\\"\"",
                 (char (*) [45])"failed: expected url.host == \"capnproto.org\"");
      local_cb1 = false;
    }
  }
  local_cc8 = Vector<kj::String>::asPtr((Vector<kj::String> *)&url_7.host.content.disposer);
  StringPtr::StringPtr((StringPtr *)local_d08,"foo");
  StringPtr::StringPtr(&local_cf8,"bar");
  local_ce8 = (iterator)local_d08;
  local_ce0 = 2;
  init_05._M_len = 2;
  init_05._M_array = local_ce8;
  ArrayPtr<const_kj::StringPtr>::ArrayPtr(&local_cd8,init_05);
  bVar3 = ArrayPtr<kj::String>::operator==(&local_cc8,&local_cd8);
  if (!bVar3) {
    f_2.exception._7_1_ = _::Debug::shouldLog(ERROR);
    while ((bool)f_2.exception._7_1_ != false) {
      _::Debug::log<char_const(&)[83]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x8d,ERROR,
                 "\"failed: expected \" \"url.path.asPtr() == kj::ArrayPtr<const StringPtr>({\\\"foo\\\", \\\"bar\\\"})\""
                 ,(char (*) [83])
                  "failed: expected url.path.asPtr() == kj::ArrayPtr<const StringPtr>({\"foo\", \"bar\"})"
                );
      f_2.exception._7_1_ = false;
    }
  }
  if (((byte)url_7.path.builder.disposer & 1) != 0) {
    f_2.exception._6_1_ = _::Debug::shouldLog(ERROR);
    while ((bool)f_2.exception._6_1_ != false) {
      _::Debug::log<char_const(&)[39]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x8e,ERROR,"\"failed: expected \" \"!url.hasTrailingSlash\"",
                 (char (*) [39])"failed: expected !url.hasTrailingSlash");
      f_2.exception._6_1_ = false;
    }
  }
  sVar4 = Vector<kj::Url::QueryParam>::size((Vector<kj::Url::QueryParam> *)&url_7.hasTrailingSlash);
  if (sVar4 != 2) {
    _::Debug::Fault::Fault
              (&local_d18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x8f,FAILED,"url.query.size() == 2","");
    _::Debug::Fault::fatal(&local_d18);
  }
  pQVar5 = Vector<kj::Url::QueryParam>::operator[]
                     ((Vector<kj::Url::QueryParam> *)&url_7.hasTrailingSlash,0);
  StringPtr::StringPtr((StringPtr *)local_d28,"baz");
  bVar3 = String::operator==(&pQVar5->name,(StringPtr *)local_d28);
  if (!bVar3) {
    local_d29 = _::Debug::shouldLog(ERROR);
    while (local_d29 != false) {
      _::Debug::log<char_const(&)[44]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x90,ERROR,"\"failed: expected \" \"url.query[0].name == \\\"baz\\\"\"",
                 (char (*) [44])"failed: expected url.query[0].name == \"baz\"");
      local_d29 = false;
    }
  }
  pQVar5 = Vector<kj::Url::QueryParam>::operator[]
                     ((Vector<kj::Url::QueryParam> *)&url_7.hasTrailingSlash,0);
  StringPtr::StringPtr((StringPtr *)local_d40,"");
  bVar3 = String::operator==(&pQVar5->value,(StringPtr *)local_d40);
  if (!bVar3) {
    local_d41 = _::Debug::shouldLog(ERROR);
    while (local_d41 != false) {
      _::Debug::log<char_const(&)[42]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x91,ERROR,"\"failed: expected \" \"url.query[0].value == \\\"\\\"\"",
                 (char (*) [42])"failed: expected url.query[0].value == \"\"");
      local_d41 = false;
    }
  }
  pQVar5 = Vector<kj::Url::QueryParam>::operator[]
                     ((Vector<kj::Url::QueryParam> *)&url_7.hasTrailingSlash,1);
  StringPtr::StringPtr((StringPtr *)local_d58,"corge");
  bVar3 = String::operator==(&pQVar5->name,(StringPtr *)local_d58);
  if (!bVar3) {
    local_d59 = _::Debug::shouldLog(ERROR);
    while (local_d59 != false) {
      _::Debug::log<char_const(&)[46]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x92,ERROR,"\"failed: expected \" \"url.query[1].name == \\\"corge\\\"\"",
                 (char (*) [46])"failed: expected url.query[1].name == \"corge\"");
      local_d59 = false;
    }
  }
  pQVar5 = Vector<kj::Url::QueryParam>::operator[]
                     ((Vector<kj::Url::QueryParam> *)&url_7.hasTrailingSlash,1);
  StringPtr::StringPtr((StringPtr *)local_d70,"grault");
  bVar3 = String::operator==(&pQVar5->value,(StringPtr *)local_d70);
  if (!bVar3) {
    _kj_result_2._7_1_ = _::Debug::shouldLog(ERROR);
    while ((bool)_kj_result_2._7_1_ != false) {
      _::Debug::log<char_const(&)[48]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x93,ERROR,"\"failed: expected \" \"url.query[1].value == \\\"grault\\\"\"",
                 (char (*) [48])"failed: expected url.query[1].value == \"grault\"");
      _kj_result_2._7_1_ = false;
    }
  }
  local_d80 = _::readMaybe<kj::String>((Maybe<kj::String> *)&url_7.query.builder.disposer);
  if (local_d80 == (String *)0x0) {
    _::Debug::Fault::Fault
              (&local_d88,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x94,FAILED,"url.fragment != nullptr","");
    _::Debug::Fault::fatal(&local_d88);
  }
  ppSVar6 = mv<kj::String*>(&local_d80);
  pSVar1 = *ppSVar6;
  local_d90 = pSVar1;
  StringPtr::StringPtr((StringPtr *)local_da0,"garply");
  bVar3 = String::operator==(pSVar1,(StringPtr *)local_da0);
  if (!bVar3) {
    url_8._223_1_ = _::Debug::shouldLog(ERROR);
    while (url_8._223_1_ != '\0') {
      _::Debug::log<char_const(&)[61]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x94,ERROR,
                 "\"failed: expected \" \"KJ_ASSERT_NONNULL(url.fragment) == \\\"garply\\\"\"",
                 (char (*) [61])"failed: expected KJ_ASSERT_NONNULL(url.fragment) == \"garply\"");
      url_8._223_1_ = 0;
    }
  }
  Url::~Url((Url *)local_c60);
  StringPtr::StringPtr
            ((StringPtr *)&local_e98,"https://capnproto.org/foo/bar/?baz=qux&corge=grault#garply");
  StringPtr::StringPtr((StringPtr *)&local_ea8,(void *)0x0);
  local_eaa = 1;
  parseAndCheck((Url *)local_e88,(StringPtr)local_e98,(StringPtr)local_ea8,(Options)0x1);
  StringPtr::StringPtr((StringPtr *)local_ec0,"https");
  bVar3 = String::operator==((String *)local_e88,(StringPtr *)local_ec0);
  if (!bVar3) {
    local_ec1 = _::Debug::shouldLog(ERROR);
    while (local_ec1 != false) {
      _::Debug::log<char_const(&)[39]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x99,ERROR,"\"failed: expected \" \"url.scheme == \\\"https\\\"\"",
                 (char (*) [39])"failed: expected url.scheme == \"https\"");
      local_ec1 = false;
    }
  }
  bVar3 = Maybe<kj::Url::UserInfo>::operator==
                    ((Maybe<kj::Url::UserInfo> *)&url_8.scheme.content.disposer,(void *)0x0);
  if (!bVar3) {
    local_ec2 = _::Debug::shouldLog(ERROR);
    while (local_ec2 != false) {
      _::Debug::log<char_const(&)[41]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x9a,ERROR,"\"failed: expected \" \"url.userInfo == nullptr\"",
                 (char (*) [41])"failed: expected url.userInfo == nullptr");
      local_ec2 = false;
    }
  }
  StringPtr::StringPtr((StringPtr *)local_ed8,"capnproto.org");
  bVar3 = String::operator==((String *)
                             ((long)&url_8.userInfo.ptr.field_1.value.password.ptr.field_1 + 0x10),
                             (StringPtr *)local_ed8);
  if (!bVar3) {
    local_ed9 = _::Debug::shouldLog(ERROR);
    while (local_ed9 != false) {
      _::Debug::log<char_const(&)[45]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x9b,ERROR,"\"failed: expected \" \"url.host == \\\"capnproto.org\\\"\"",
                 (char (*) [45])"failed: expected url.host == \"capnproto.org\"");
      local_ed9 = false;
    }
  }
  local_ef0 = Vector<kj::String>::asPtr((Vector<kj::String> *)&url_8.host.content.disposer);
  StringPtr::StringPtr((StringPtr *)local_f30,"foo");
  StringPtr::StringPtr(&local_f20,"bar");
  local_f10 = (iterator)local_f30;
  local_f08 = 2;
  init_04._M_len = 2;
  init_04._M_array = local_f10;
  ArrayPtr<const_kj::StringPtr>::ArrayPtr(&local_f00,init_04);
  bVar3 = ArrayPtr<kj::String>::operator==(&local_ef0,&local_f00);
  if (!bVar3) {
    f_3.exception._7_1_ = _::Debug::shouldLog(ERROR);
    while ((bool)f_3.exception._7_1_ != false) {
      _::Debug::log<char_const(&)[83]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x9c,ERROR,
                 "\"failed: expected \" \"url.path.asPtr() == kj::ArrayPtr<const StringPtr>({\\\"foo\\\", \\\"bar\\\"})\""
                 ,(char (*) [83])
                  "failed: expected url.path.asPtr() == kj::ArrayPtr<const StringPtr>({\"foo\", \"bar\"})"
                );
      f_3.exception._7_1_ = false;
    }
  }
  if (((byte)url_8.path.builder.disposer & 1) == 0) {
    f_3.exception._6_1_ = _::Debug::shouldLog(ERROR);
    while ((bool)f_3.exception._6_1_ != false) {
      _::Debug::log<char_const(&)[38]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x9d,ERROR,"\"failed: expected \" \"url.hasTrailingSlash\"",
                 (char (*) [38])"failed: expected url.hasTrailingSlash");
      f_3.exception._6_1_ = false;
    }
  }
  sVar4 = Vector<kj::Url::QueryParam>::size((Vector<kj::Url::QueryParam> *)&url_8.hasTrailingSlash);
  if (sVar4 != 2) {
    _::Debug::Fault::Fault
              (&local_f40,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x9e,FAILED,"url.query.size() == 2","");
    _::Debug::Fault::fatal(&local_f40);
  }
  pQVar5 = Vector<kj::Url::QueryParam>::operator[]
                     ((Vector<kj::Url::QueryParam> *)&url_8.hasTrailingSlash,0);
  StringPtr::StringPtr((StringPtr *)local_f50,"baz");
  bVar3 = String::operator==(&pQVar5->name,(StringPtr *)local_f50);
  if (!bVar3) {
    local_f51 = _::Debug::shouldLog(ERROR);
    while (local_f51 != false) {
      _::Debug::log<char_const(&)[44]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x9f,ERROR,"\"failed: expected \" \"url.query[0].name == \\\"baz\\\"\"",
                 (char (*) [44])"failed: expected url.query[0].name == \"baz\"");
      local_f51 = false;
    }
  }
  pQVar5 = Vector<kj::Url::QueryParam>::operator[]
                     ((Vector<kj::Url::QueryParam> *)&url_8.hasTrailingSlash,0);
  StringPtr::StringPtr((StringPtr *)local_f68,"qux");
  bVar3 = String::operator==(&pQVar5->value,(StringPtr *)local_f68);
  if (!bVar3) {
    local_f69 = _::Debug::shouldLog(ERROR);
    while (local_f69 != false) {
      _::Debug::log<char_const(&)[45]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xa0,ERROR,"\"failed: expected \" \"url.query[0].value == \\\"qux\\\"\"",
                 (char (*) [45])"failed: expected url.query[0].value == \"qux\"");
      local_f69 = false;
    }
  }
  pQVar5 = Vector<kj::Url::QueryParam>::operator[]
                     ((Vector<kj::Url::QueryParam> *)&url_8.hasTrailingSlash,1);
  StringPtr::StringPtr((StringPtr *)local_f80,"corge");
  bVar3 = String::operator==(&pQVar5->name,(StringPtr *)local_f80);
  if (!bVar3) {
    local_f81 = _::Debug::shouldLog(ERROR);
    while (local_f81 != false) {
      _::Debug::log<char_const(&)[46]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xa1,ERROR,"\"failed: expected \" \"url.query[1].name == \\\"corge\\\"\"",
                 (char (*) [46])"failed: expected url.query[1].name == \"corge\"");
      local_f81 = false;
    }
  }
  pQVar5 = Vector<kj::Url::QueryParam>::operator[]
                     ((Vector<kj::Url::QueryParam> *)&url_8.hasTrailingSlash,1);
  StringPtr::StringPtr((StringPtr *)local_f98,"grault");
  bVar3 = String::operator==(&pQVar5->value,(StringPtr *)local_f98);
  if (!bVar3) {
    _kj_result_3._7_1_ = _::Debug::shouldLog(ERROR);
    while ((bool)_kj_result_3._7_1_ != false) {
      _::Debug::log<char_const(&)[48]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xa2,ERROR,"\"failed: expected \" \"url.query[1].value == \\\"grault\\\"\"",
                 (char (*) [48])"failed: expected url.query[1].value == \"grault\"");
      _kj_result_3._7_1_ = false;
    }
  }
  local_fa8 = _::readMaybe<kj::String>((Maybe<kj::String> *)&url_8.query.builder.disposer);
  if (local_fa8 == (String *)0x0) {
    _::Debug::Fault::Fault
              (&local_fb0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0xa3,FAILED,"url.fragment != nullptr","");
    _::Debug::Fault::fatal(&local_fb0);
  }
  ppSVar6 = mv<kj::String*>(&local_fa8);
  pSVar1 = *ppSVar6;
  local_fb8 = pSVar1;
  StringPtr::StringPtr((StringPtr *)local_fc8,"garply");
  bVar3 = String::operator==(pSVar1,(StringPtr *)local_fc8);
  if (!bVar3) {
    url_9._223_1_ = _::Debug::shouldLog(ERROR);
    while (url_9._223_1_ != '\0') {
      _::Debug::log<char_const(&)[61]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xa3,ERROR,
                 "\"failed: expected \" \"KJ_ASSERT_NONNULL(url.fragment) == \\\"garply\\\"\"",
                 (char (*) [61])"failed: expected KJ_ASSERT_NONNULL(url.fragment) == \"garply\"");
      url_9._223_1_ = 0;
    }
  }
  Url::~Url((Url *)local_e88);
  StringPtr::StringPtr((StringPtr *)&local_10c0,"https://capnproto.org/foo/bar?baz=qux#garply");
  StringPtr::StringPtr((StringPtr *)&local_10d0,(void *)0x0);
  local_10d2 = 1;
  parseAndCheck((Url *)local_10b0,(StringPtr)local_10c0,(StringPtr)local_10d0,(Options)0x1);
  StringPtr::StringPtr((StringPtr *)local_10e8,"https");
  bVar3 = String::operator==((String *)local_10b0,(StringPtr *)local_10e8);
  if (!bVar3) {
    local_10e9 = _::Debug::shouldLog(ERROR);
    while (local_10e9 != false) {
      _::Debug::log<char_const(&)[39]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xa8,ERROR,"\"failed: expected \" \"url.scheme == \\\"https\\\"\"",
                 (char (*) [39])"failed: expected url.scheme == \"https\"");
      local_10e9 = false;
    }
  }
  bVar3 = Maybe<kj::Url::UserInfo>::operator==
                    ((Maybe<kj::Url::UserInfo> *)&url_9.scheme.content.disposer,(void *)0x0);
  if (!bVar3) {
    local_10ea = _::Debug::shouldLog(ERROR);
    while (local_10ea != false) {
      _::Debug::log<char_const(&)[41]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xa9,ERROR,"\"failed: expected \" \"url.userInfo == nullptr\"",
                 (char (*) [41])"failed: expected url.userInfo == nullptr");
      local_10ea = false;
    }
  }
  StringPtr::StringPtr((StringPtr *)local_1100,"capnproto.org");
  bVar3 = String::operator==((String *)
                             ((long)&url_9.userInfo.ptr.field_1.value.password.ptr.field_1 + 0x10),
                             (StringPtr *)local_1100);
  if (!bVar3) {
    local_1101 = _::Debug::shouldLog(ERROR);
    while (local_1101 != false) {
      _::Debug::log<char_const(&)[45]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xaa,ERROR,"\"failed: expected \" \"url.host == \\\"capnproto.org\\\"\"",
                 (char (*) [45])"failed: expected url.host == \"capnproto.org\"");
      local_1101 = false;
    }
  }
  local_1118 = Vector<kj::String>::asPtr((Vector<kj::String> *)&url_9.host.content.disposer);
  StringPtr::StringPtr((StringPtr *)local_1158,"foo");
  StringPtr::StringPtr(&local_1148,"bar");
  local_1138 = (iterator)local_1158;
  local_1130 = 2;
  init_03._M_len = 2;
  init_03._M_array = local_1138;
  ArrayPtr<const_kj::StringPtr>::ArrayPtr(&local_1128,init_03);
  bVar3 = ArrayPtr<kj::String>::operator==(&local_1118,&local_1128);
  if (!bVar3) {
    f_4.exception._7_1_ = _::Debug::shouldLog(ERROR);
    while ((bool)f_4.exception._7_1_ != false) {
      _::Debug::log<char_const(&)[83]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xab,ERROR,
                 "\"failed: expected \" \"url.path.asPtr() == kj::ArrayPtr<const StringPtr>({\\\"foo\\\", \\\"bar\\\"})\""
                 ,(char (*) [83])
                  "failed: expected url.path.asPtr() == kj::ArrayPtr<const StringPtr>({\"foo\", \"bar\"})"
                );
      f_4.exception._7_1_ = false;
    }
  }
  if (((byte)url_9.path.builder.disposer & 1) != 0) {
    f_4.exception._6_1_ = _::Debug::shouldLog(ERROR);
    while ((bool)f_4.exception._6_1_ != false) {
      _::Debug::log<char_const(&)[39]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xac,ERROR,"\"failed: expected \" \"!url.hasTrailingSlash\"",
                 (char (*) [39])"failed: expected !url.hasTrailingSlash");
      f_4.exception._6_1_ = false;
    }
  }
  sVar4 = Vector<kj::Url::QueryParam>::size((Vector<kj::Url::QueryParam> *)&url_9.hasTrailingSlash);
  if (sVar4 != 1) {
    _::Debug::Fault::Fault
              (&local_1168,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0xad,FAILED,"url.query.size() == 1","");
    _::Debug::Fault::fatal(&local_1168);
  }
  pQVar5 = Vector<kj::Url::QueryParam>::operator[]
                     ((Vector<kj::Url::QueryParam> *)&url_9.hasTrailingSlash,0);
  StringPtr::StringPtr((StringPtr *)local_1178,"baz");
  bVar3 = String::operator==(&pQVar5->name,(StringPtr *)local_1178);
  if (!bVar3) {
    local_1179 = _::Debug::shouldLog(ERROR);
    while (local_1179 != false) {
      _::Debug::log<char_const(&)[44]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xae,ERROR,"\"failed: expected \" \"url.query[0].name == \\\"baz\\\"\"",
                 (char (*) [44])"failed: expected url.query[0].name == \"baz\"");
      local_1179 = false;
    }
  }
  pQVar5 = Vector<kj::Url::QueryParam>::operator[]
                     ((Vector<kj::Url::QueryParam> *)&url_9.hasTrailingSlash,0);
  StringPtr::StringPtr((StringPtr *)local_1190,"qux");
  bVar3 = String::operator==(&pQVar5->value,(StringPtr *)local_1190);
  if (!bVar3) {
    _kj_result_4._7_1_ = _::Debug::shouldLog(ERROR);
    while ((bool)_kj_result_4._7_1_ != false) {
      _::Debug::log<char_const(&)[45]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xaf,ERROR,"\"failed: expected \" \"url.query[0].value == \\\"qux\\\"\"",
                 (char (*) [45])"failed: expected url.query[0].value == \"qux\"");
      _kj_result_4._7_1_ = false;
    }
  }
  local_11a0 = _::readMaybe<kj::String>((Maybe<kj::String> *)&url_9.query.builder.disposer);
  if (local_11a0 == (String *)0x0) {
    _::Debug::Fault::Fault
              (&local_11a8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0xb0,FAILED,"url.fragment != nullptr","");
    _::Debug::Fault::fatal(&local_11a8);
  }
  ppSVar6 = mv<kj::String*>(&local_11a0);
  pSVar1 = *ppSVar6;
  local_11b0 = pSVar1;
  StringPtr::StringPtr((StringPtr *)local_11c0,"garply");
  bVar3 = String::operator==(pSVar1,(StringPtr *)local_11c0);
  if (!bVar3) {
    url_10._223_1_ = _::Debug::shouldLog(ERROR);
    while (url_10._223_1_ != '\0') {
      _::Debug::log<char_const(&)[61]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xb0,ERROR,
                 "\"failed: expected \" \"KJ_ASSERT_NONNULL(url.fragment) == \\\"garply\\\"\"",
                 (char (*) [61])"failed: expected KJ_ASSERT_NONNULL(url.fragment) == \"garply\"");
      url_10._223_1_ = 0;
    }
  }
  Url::~Url((Url *)local_10b0);
  StringPtr::StringPtr((StringPtr *)&local_12b8,"https://capnproto.org/foo?bar%20baz=qux+quux");
  StringPtr::StringPtr((StringPtr *)&local_12c8,"https://capnproto.org/foo?bar+baz=qux+quux");
  f_5.exception._6_2_ = 1;
  parseAndCheck((Url *)local_12a8,(StringPtr)local_12b8,(StringPtr)local_12c8,(Options)0x1);
  sVar4 = Vector<kj::Url::QueryParam>::size((Vector<kj::Url::QueryParam> *)&url_10.hasTrailingSlash)
  ;
  if (sVar4 != 1) {
    _::Debug::Fault::Fault
              (&local_12d8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0xb6,FAILED,"url.query.size() == 1","");
    _::Debug::Fault::fatal(&local_12d8);
  }
  pQVar5 = Vector<kj::Url::QueryParam>::operator[]
                     ((Vector<kj::Url::QueryParam> *)&url_10.hasTrailingSlash,0);
  StringPtr::StringPtr((StringPtr *)local_12e8,"bar baz");
  bVar3 = String::operator==(&pQVar5->name,(StringPtr *)local_12e8);
  if (!bVar3) {
    local_12e9 = _::Debug::shouldLog(ERROR);
    while (local_12e9 != false) {
      _::Debug::log<char_const(&)[48]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xb7,ERROR,"\"failed: expected \" \"url.query[0].name == \\\"bar baz\\\"\"",
                 (char (*) [48])"failed: expected url.query[0].name == \"bar baz\"");
      local_12e9 = false;
    }
  }
  pQVar5 = Vector<kj::Url::QueryParam>::operator[]
                     ((Vector<kj::Url::QueryParam> *)&url_10.hasTrailingSlash,0);
  StringPtr::StringPtr((StringPtr *)local_1300,"qux quux");
  bVar3 = String::operator==(&pQVar5->value,(StringPtr *)local_1300);
  if (!bVar3) {
    url_11._223_1_ = _::Debug::shouldLog(ERROR);
    while (url_11._223_1_ != '\0') {
      _::Debug::log<char_const(&)[50]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xb8,ERROR,"\"failed: expected \" \"url.query[0].value == \\\"qux quux\\\"\"",
                 (char (*) [50])"failed: expected url.query[0].value == \"qux quux\"");
      url_11._223_1_ = 0;
    }
  }
  Url::~Url((Url *)local_12a8);
  StringPtr::StringPtr((StringPtr *)&local_13f8,"https://capnproto.org/foo/bar#garply");
  StringPtr::StringPtr((StringPtr *)&local_1408,(void *)0x0);
  local_140a = 1;
  parseAndCheck((Url *)local_13e8,(StringPtr)local_13f8,(StringPtr)local_1408,(Options)0x1);
  StringPtr::StringPtr((StringPtr *)local_1420,"https");
  bVar3 = String::operator==((String *)local_13e8,(StringPtr *)local_1420);
  if (!bVar3) {
    local_1421 = _::Debug::shouldLog(ERROR);
    while (local_1421 != false) {
      _::Debug::log<char_const(&)[39]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xbd,ERROR,"\"failed: expected \" \"url.scheme == \\\"https\\\"\"",
                 (char (*) [39])"failed: expected url.scheme == \"https\"");
      local_1421 = false;
    }
  }
  bVar3 = Maybe<kj::Url::UserInfo>::operator==
                    ((Maybe<kj::Url::UserInfo> *)&url_11.scheme.content.disposer,(void *)0x0);
  if (!bVar3) {
    local_1422 = _::Debug::shouldLog(ERROR);
    while (local_1422 != false) {
      _::Debug::log<char_const(&)[41]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xbe,ERROR,"\"failed: expected \" \"url.userInfo == nullptr\"",
                 (char (*) [41])"failed: expected url.userInfo == nullptr");
      local_1422 = false;
    }
  }
  StringPtr::StringPtr((StringPtr *)local_1438,"capnproto.org");
  bVar3 = String::operator==((String *)
                             ((long)&url_11.userInfo.ptr.field_1.value.password.ptr.field_1 + 0x10),
                             (StringPtr *)local_1438);
  if (!bVar3) {
    local_1439 = _::Debug::shouldLog(ERROR);
    while (local_1439 != false) {
      _::Debug::log<char_const(&)[45]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xbf,ERROR,"\"failed: expected \" \"url.host == \\\"capnproto.org\\\"\"",
                 (char (*) [45])"failed: expected url.host == \"capnproto.org\"");
      local_1439 = false;
    }
  }
  local_1450 = Vector<kj::String>::asPtr((Vector<kj::String> *)&url_11.host.content.disposer);
  StringPtr::StringPtr((StringPtr *)local_1490,"foo");
  StringPtr::StringPtr(&local_1480,"bar");
  local_1470 = (iterator)local_1490;
  local_1468 = 2;
  init_02._M_len = 2;
  init_02._M_array = local_1470;
  ArrayPtr<const_kj::StringPtr>::ArrayPtr(&local_1460,init_02);
  bVar3 = ArrayPtr<kj::String>::operator==(&local_1450,&local_1460);
  if (!bVar3) {
    local_1491 = _::Debug::shouldLog(ERROR);
    while (local_1491 != false) {
      _::Debug::log<char_const(&)[83]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xc0,ERROR,
                 "\"failed: expected \" \"url.path.asPtr() == kj::ArrayPtr<const StringPtr>({\\\"foo\\\", \\\"bar\\\"})\""
                 ,(char (*) [83])
                  "failed: expected url.path.asPtr() == kj::ArrayPtr<const StringPtr>({\"foo\", \"bar\"})"
                );
      local_1491 = false;
    }
  }
  if (((byte)url_11.path.builder.disposer & 1) != 0) {
    local_1492 = _::Debug::shouldLog(ERROR);
    while (local_1492 != false) {
      _::Debug::log<char_const(&)[39]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xc1,ERROR,"\"failed: expected \" \"!url.hasTrailingSlash\"",
                 (char (*) [39])"failed: expected !url.hasTrailingSlash");
      local_1492 = false;
    }
  }
  pvStack_14a0 = (void *)0x0;
  bVar3 = Vector<kj::Url::QueryParam>::operator==
                    ((Vector<kj::Url::QueryParam> *)&url_11.hasTrailingSlash,
                     &stack0xffffffffffffeb60);
  if (!bVar3) {
    _kj_result_5._7_1_ = _::Debug::shouldLog(ERROR);
    while ((bool)_kj_result_5._7_1_ != false) {
      _::Debug::log<char_const(&)[38]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xc2,ERROR,"\"failed: expected \" \"url.query == nullptr\"",
                 (char (*) [38])"failed: expected url.query == nullptr");
      _kj_result_5._7_1_ = false;
    }
  }
  local_14b0 = _::readMaybe<kj::String>((Maybe<kj::String> *)&url_11.query.builder.disposer);
  if (local_14b0 == (String *)0x0) {
    _::Debug::Fault::Fault
              (&local_14b8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0xc3,FAILED,"url.fragment != nullptr","");
    _::Debug::Fault::fatal(&local_14b8);
  }
  ppSVar6 = mv<kj::String*>(&local_14b0);
  pSVar1 = *ppSVar6;
  local_14c0 = pSVar1;
  StringPtr::StringPtr((StringPtr *)local_14d0,"garply");
  bVar3 = String::operator==(pSVar1,(StringPtr *)local_14d0);
  if (!bVar3) {
    url_12._223_1_ = _::Debug::shouldLog(ERROR);
    while (url_12._223_1_ != '\0') {
      _::Debug::log<char_const(&)[61]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xc3,ERROR,
                 "\"failed: expected \" \"KJ_ASSERT_NONNULL(url.fragment) == \\\"garply\\\"\"",
                 (char (*) [61])"failed: expected KJ_ASSERT_NONNULL(url.fragment) == \"garply\"");
      url_12._223_1_ = 0;
    }
  }
  Url::~Url((Url *)local_13e8);
  StringPtr::StringPtr((StringPtr *)&local_15c8,"https://capnproto.org/foo/bar/#garply");
  StringPtr::StringPtr((StringPtr *)&local_15d8,(void *)0x0);
  local_15da = 1;
  parseAndCheck((Url *)local_15b8,(StringPtr)local_15c8,(StringPtr)local_15d8,(Options)0x1);
  StringPtr::StringPtr((StringPtr *)local_15f0,"https");
  bVar3 = String::operator==((String *)local_15b8,(StringPtr *)local_15f0);
  if (!bVar3) {
    local_15f1 = _::Debug::shouldLog(ERROR);
    while (local_15f1 != false) {
      _::Debug::log<char_const(&)[39]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,200,ERROR,"\"failed: expected \" \"url.scheme == \\\"https\\\"\"",
                 (char (*) [39])"failed: expected url.scheme == \"https\"");
      local_15f1 = false;
    }
  }
  bVar3 = Maybe<kj::Url::UserInfo>::operator==
                    ((Maybe<kj::Url::UserInfo> *)&url_12.scheme.content.disposer,(void *)0x0);
  if (!bVar3) {
    local_15f2 = _::Debug::shouldLog(ERROR);
    while (local_15f2 != false) {
      _::Debug::log<char_const(&)[41]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xc9,ERROR,"\"failed: expected \" \"url.userInfo == nullptr\"",
                 (char (*) [41])"failed: expected url.userInfo == nullptr");
      local_15f2 = false;
    }
  }
  StringPtr::StringPtr((StringPtr *)local_1608,"capnproto.org");
  bVar3 = String::operator==((String *)
                             ((long)&url_12.userInfo.ptr.field_1.value.password.ptr.field_1 + 0x10),
                             (StringPtr *)local_1608);
  if (!bVar3) {
    local_1609 = _::Debug::shouldLog(ERROR);
    while (local_1609 != false) {
      _::Debug::log<char_const(&)[45]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xca,ERROR,"\"failed: expected \" \"url.host == \\\"capnproto.org\\\"\"",
                 (char (*) [45])"failed: expected url.host == \"capnproto.org\"");
      local_1609 = false;
    }
  }
  local_1620 = Vector<kj::String>::asPtr((Vector<kj::String> *)&url_12.host.content.disposer);
  StringPtr::StringPtr((StringPtr *)local_1660,"foo");
  StringPtr::StringPtr(&local_1650,"bar");
  local_1640 = (iterator)local_1660;
  local_1638 = 2;
  init_01._M_len = 2;
  init_01._M_array = local_1640;
  ArrayPtr<const_kj::StringPtr>::ArrayPtr(&local_1630,init_01);
  bVar3 = ArrayPtr<kj::String>::operator==(&local_1620,&local_1630);
  if (!bVar3) {
    local_1661 = _::Debug::shouldLog(ERROR);
    while (local_1661 != false) {
      _::Debug::log<char_const(&)[83]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xcb,ERROR,
                 "\"failed: expected \" \"url.path.asPtr() == kj::ArrayPtr<const StringPtr>({\\\"foo\\\", \\\"bar\\\"})\""
                 ,(char (*) [83])
                  "failed: expected url.path.asPtr() == kj::ArrayPtr<const StringPtr>({\"foo\", \"bar\"})"
                );
      local_1661 = false;
    }
  }
  if (((byte)url_12.path.builder.disposer & 1) == 0) {
    local_1662 = _::Debug::shouldLog(ERROR);
    while (local_1662 != false) {
      _::Debug::log<char_const(&)[38]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xcc,ERROR,"\"failed: expected \" \"url.hasTrailingSlash\"",
                 (char (*) [38])"failed: expected url.hasTrailingSlash");
      local_1662 = false;
    }
  }
  pvStack_1670 = (void *)0x0;
  bVar3 = Vector<kj::Url::QueryParam>::operator==
                    ((Vector<kj::Url::QueryParam> *)&url_12.hasTrailingSlash,
                     &stack0xffffffffffffe990);
  if (!bVar3) {
    _kj_result_6._7_1_ = _::Debug::shouldLog(ERROR);
    while ((bool)_kj_result_6._7_1_ != false) {
      _::Debug::log<char_const(&)[38]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xcd,ERROR,"\"failed: expected \" \"url.query == nullptr\"",
                 (char (*) [38])"failed: expected url.query == nullptr");
      _kj_result_6._7_1_ = false;
    }
  }
  local_1680 = _::readMaybe<kj::String>((Maybe<kj::String> *)&url_12.query.builder.disposer);
  if (local_1680 == (String *)0x0) {
    _::Debug::Fault::Fault
              (&local_1688,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0xce,FAILED,"url.fragment != nullptr","");
    _::Debug::Fault::fatal(&local_1688);
  }
  ppSVar6 = mv<kj::String*>(&local_1680);
  pSVar1 = *ppSVar6;
  local_1690 = pSVar1;
  StringPtr::StringPtr((StringPtr *)local_16a0,"garply");
  bVar3 = String::operator==(pSVar1,(StringPtr *)local_16a0);
  if (!bVar3) {
    url_13._223_1_ = _::Debug::shouldLog(ERROR);
    while (url_13._223_1_ != '\0') {
      _::Debug::log<char_const(&)[61]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xce,ERROR,
                 "\"failed: expected \" \"KJ_ASSERT_NONNULL(url.fragment) == \\\"garply\\\"\"",
                 (char (*) [61])"failed: expected KJ_ASSERT_NONNULL(url.fragment) == \"garply\"");
      url_13._223_1_ = 0;
    }
  }
  Url::~Url((Url *)local_15b8);
  StringPtr::StringPtr((StringPtr *)&local_1798,"https://capnproto.org#garply");
  StringPtr::StringPtr((StringPtr *)&local_17a8,(void *)0x0);
  local_17aa = 1;
  parseAndCheck((Url *)local_1788,(StringPtr)local_1798,(StringPtr)local_17a8,(Options)0x1);
  StringPtr::StringPtr((StringPtr *)local_17c0,"https");
  bVar3 = String::operator==((String *)local_1788,(StringPtr *)local_17c0);
  if (!bVar3) {
    local_17c1 = _::Debug::shouldLog(ERROR);
    while (local_17c1 != false) {
      _::Debug::log<char_const(&)[39]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xd3,ERROR,"\"failed: expected \" \"url.scheme == \\\"https\\\"\"",
                 (char (*) [39])"failed: expected url.scheme == \"https\"");
      local_17c1 = false;
    }
  }
  bVar3 = Maybe<kj::Url::UserInfo>::operator==
                    ((Maybe<kj::Url::UserInfo> *)&url_13.scheme.content.disposer,(void *)0x0);
  if (!bVar3) {
    local_17c2 = _::Debug::shouldLog(ERROR);
    while (local_17c2 != false) {
      _::Debug::log<char_const(&)[41]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xd4,ERROR,"\"failed: expected \" \"url.userInfo == nullptr\"",
                 (char (*) [41])"failed: expected url.userInfo == nullptr");
      local_17c2 = false;
    }
  }
  StringPtr::StringPtr((StringPtr *)local_17d8,"capnproto.org");
  bVar3 = String::operator==((String *)
                             ((long)&url_13.userInfo.ptr.field_1.value.password.ptr.field_1 + 0x10),
                             (StringPtr *)local_17d8);
  if (!bVar3) {
    local_17d9 = _::Debug::shouldLog(ERROR);
    while (local_17d9 != false) {
      _::Debug::log<char_const(&)[45]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xd5,ERROR,"\"failed: expected \" \"url.host == \\\"capnproto.org\\\"\"",
                 (char (*) [45])"failed: expected url.host == \"capnproto.org\"");
      local_17d9 = false;
    }
  }
  pvStack_17e8 = (void *)0x0;
  bVar3 = Vector<kj::String>::operator==
                    ((Vector<kj::String> *)&url_13.host.content.disposer,&stack0xffffffffffffe818);
  if (!bVar3) {
    local_17e9 = _::Debug::shouldLog(ERROR);
    while (local_17e9 != false) {
      _::Debug::log<char_const(&)[37]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xd6,ERROR,"\"failed: expected \" \"url.path == nullptr\"",
                 (char (*) [37])"failed: expected url.path == nullptr");
      local_17e9 = false;
    }
  }
  if (((byte)url_13.path.builder.disposer & 1) != 0) {
    local_17ea = _::Debug::shouldLog(ERROR);
    while (local_17ea != false) {
      _::Debug::log<char_const(&)[39]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xd7,ERROR,"\"failed: expected \" \"!url.hasTrailingSlash\"",
                 (char (*) [39])"failed: expected !url.hasTrailingSlash");
      local_17ea = false;
    }
  }
  pvStack_17f8 = (void *)0x0;
  bVar3 = Vector<kj::Url::QueryParam>::operator==
                    ((Vector<kj::Url::QueryParam> *)&url_13.hasTrailingSlash,
                     &stack0xffffffffffffe808);
  if (!bVar3) {
    _kj_result_7._7_1_ = _::Debug::shouldLog(ERROR);
    while ((bool)_kj_result_7._7_1_ != false) {
      _::Debug::log<char_const(&)[38]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xd8,ERROR,"\"failed: expected \" \"url.query == nullptr\"",
                 (char (*) [38])"failed: expected url.query == nullptr");
      _kj_result_7._7_1_ = false;
    }
  }
  local_1808 = _::readMaybe<kj::String>((Maybe<kj::String> *)&url_13.query.builder.disposer);
  if (local_1808 != (String *)0x0) {
    ppSVar6 = mv<kj::String*>(&local_1808);
    pSVar1 = *ppSVar6;
    local_1818 = pSVar1;
    StringPtr::StringPtr((StringPtr *)local_1828,"garply");
    bVar3 = String::operator==(pSVar1,(StringPtr *)local_1828);
    if (!bVar3) {
      url_14._223_1_ = _::Debug::shouldLog(ERROR);
      while (url_14._223_1_ != '\0') {
        _::Debug::log<char_const(&)[61]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                   ,0xd9,ERROR,
                   "\"failed: expected \" \"KJ_ASSERT_NONNULL(url.fragment) == \\\"garply\\\"\"",
                   (char (*) [61])"failed: expected KJ_ASSERT_NONNULL(url.fragment) == \"garply\"");
        url_14._223_1_ = 0;
      }
    }
    Url::~Url((Url *)local_1788);
    StringPtr::StringPtr((StringPtr *)&local_1920,"https://capnproto.org/#garply");
    StringPtr::StringPtr((StringPtr *)&local_1930,(void *)0x0);
    local_1932 = 1;
    parseAndCheck((Url *)local_1910,(StringPtr)local_1920,(StringPtr)local_1930,(Options)0x1);
    StringPtr::StringPtr((StringPtr *)local_1948,"https");
    bVar3 = String::operator==((String *)local_1910,(StringPtr *)local_1948);
    if (!bVar3) {
      local_1949 = _::Debug::shouldLog(ERROR);
      while (local_1949 != false) {
        _::Debug::log<char_const(&)[39]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                   ,0xde,ERROR,"\"failed: expected \" \"url.scheme == \\\"https\\\"\"",
                   (char (*) [39])"failed: expected url.scheme == \"https\"");
        local_1949 = false;
      }
    }
    bVar3 = Maybe<kj::Url::UserInfo>::operator==
                      ((Maybe<kj::Url::UserInfo> *)&url_14.scheme.content.disposer,(void *)0x0);
    if (!bVar3) {
      local_194a = _::Debug::shouldLog(ERROR);
      while (local_194a != false) {
        _::Debug::log<char_const(&)[41]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                   ,0xdf,ERROR,"\"failed: expected \" \"url.userInfo == nullptr\"",
                   (char (*) [41])"failed: expected url.userInfo == nullptr");
        local_194a = false;
      }
    }
    StringPtr::StringPtr((StringPtr *)local_1960,"capnproto.org");
    bVar3 = String::operator==((String *)
                               ((long)&url_14.userInfo.ptr.field_1.value.password.ptr.field_1 + 0x10
                               ),(StringPtr *)local_1960);
    if (!bVar3) {
      local_1961 = _::Debug::shouldLog(ERROR);
      while (local_1961 != false) {
        _::Debug::log<char_const(&)[45]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                   ,0xe0,ERROR,"\"failed: expected \" \"url.host == \\\"capnproto.org\\\"\"",
                   (char (*) [45])"failed: expected url.host == \"capnproto.org\"");
        local_1961 = false;
      }
    }
    pvStack_1970 = (void *)0x0;
    bVar3 = Vector<kj::String>::operator==
                      ((Vector<kj::String> *)&url_14.host.content.disposer,&stack0xffffffffffffe690)
    ;
    if (!bVar3) {
      local_1971 = _::Debug::shouldLog(ERROR);
      while (local_1971 != false) {
        _::Debug::log<char_const(&)[37]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                   ,0xe1,ERROR,"\"failed: expected \" \"url.path == nullptr\"",
                   (char (*) [37])"failed: expected url.path == nullptr");
        local_1971 = false;
      }
    }
    if (((byte)url_14.path.builder.disposer & 1) == 0) {
      local_1972 = _::Debug::shouldLog(ERROR);
      while (local_1972 != false) {
        _::Debug::log<char_const(&)[38]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                   ,0xe2,ERROR,"\"failed: expected \" \"url.hasTrailingSlash\"",
                   (char (*) [38])"failed: expected url.hasTrailingSlash");
        local_1972 = false;
      }
    }
    pvStack_1980 = (void *)0x0;
    bVar3 = Vector<kj::Url::QueryParam>::operator==
                      ((Vector<kj::Url::QueryParam> *)&url_14.hasTrailingSlash,
                       &stack0xffffffffffffe680);
    if (!bVar3) {
      _kj_result_8._7_1_ = _::Debug::shouldLog(ERROR);
      while ((bool)_kj_result_8._7_1_ != false) {
        _::Debug::log<char_const(&)[38]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                   ,0xe3,ERROR,"\"failed: expected \" \"url.query == nullptr\"",
                   (char (*) [38])"failed: expected url.query == nullptr");
        _kj_result_8._7_1_ = false;
      }
    }
    local_1990 = _::readMaybe<kj::String>((Maybe<kj::String> *)&url_14.query.builder.disposer);
    if (local_1990 == (String *)0x0) {
      _::Debug::Fault::Fault
                (&local_1998,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xe4,FAILED,"url.fragment != nullptr","");
      _::Debug::Fault::fatal(&local_1998);
    }
    ppSVar6 = mv<kj::String*>(&local_1990);
    pSVar1 = *ppSVar6;
    local_19a0 = pSVar1;
    StringPtr::StringPtr((StringPtr *)local_19b0,"garply");
    bVar3 = String::operator==(pSVar1,(StringPtr *)local_19b0);
    if (!bVar3) {
      url_15._223_1_ = _::Debug::shouldLog(ERROR);
      while (url_15._223_1_ != '\0') {
        _::Debug::log<char_const(&)[61]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                   ,0xe4,ERROR,
                   "\"failed: expected \" \"KJ_ASSERT_NONNULL(url.fragment) == \\\"garply\\\"\"",
                   (char (*) [61])"failed: expected KJ_ASSERT_NONNULL(url.fragment) == \"garply\"");
        url_15._223_1_ = 0;
      }
    }
    Url::~Url((Url *)local_1910);
    StringPtr::StringPtr((StringPtr *)&local_1aa8,"https://foo@capnproto.org");
    StringPtr::StringPtr((StringPtr *)&local_1ab8,(void *)0x0);
    local_1aba = 1;
    parseAndCheck((Url *)local_1a98,(StringPtr)local_1aa8,(StringPtr)local_1ab8,(Options)0x1);
    StringPtr::StringPtr((StringPtr *)local_1ad0,"https");
    bVar3 = String::operator==((String *)local_1a98,(StringPtr *)local_1ad0);
    if (!bVar3) {
      user._7_1_ = _::Debug::shouldLog(ERROR);
      while ((bool)user._7_1_ != false) {
        _::Debug::log<char_const(&)[39]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                   ,0xe9,ERROR,"\"failed: expected \" \"url.scheme == \\\"https\\\"\"",
                   (char (*) [39])"failed: expected url.scheme == \"https\"");
        user._7_1_ = false;
      }
    }
    local_1ae8 = _::readMaybe<kj::Url::UserInfo>
                           ((Maybe<kj::Url::UserInfo> *)&url_15.scheme.content.disposer);
    if (local_1ae8 != (UserInfo *)0x0) {
      ppUVar7 = mv<kj::Url::UserInfo*>(&local_1ae8);
      pUVar2 = *ppUVar7;
      local_1af8 = pUVar2;
      _kj_result_9 = pUVar2;
      StringPtr::StringPtr((StringPtr *)local_1b08,"foo");
      bVar3 = String::operator==(&pUVar2->username,(StringPtr *)local_1b08);
      if (!bVar3) {
        local_1b09 = _::Debug::shouldLog(ERROR);
        while (local_1b09 != false) {
          _::Debug::log<char_const(&)[40]>
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                     ,0xeb,ERROR,"\"failed: expected \" \"user.username == \\\"foo\\\"\"",
                     (char (*) [40])"failed: expected user.username == \"foo\"");
          local_1b09 = false;
        }
      }
      bVar3 = Maybe<kj::String>::operator==(&_kj_result_9->password,(void *)0x0);
      if (!bVar3) {
        local_1b0a = _::Debug::shouldLog(ERROR);
        while (local_1b0a != false) {
          _::Debug::log<char_const(&)[42]>
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                     ,0xec,ERROR,"\"failed: expected \" \"user.password == nullptr\"",
                     (char (*) [42])"failed: expected user.password == nullptr");
          local_1b0a = false;
        }
      }
      StringPtr::StringPtr((StringPtr *)local_1b20,"capnproto.org");
      bVar3 = String::operator==((String *)
                                 ((long)&url_15.userInfo.ptr.field_1.value.password.ptr.field_1 +
                                 0x10),(StringPtr *)local_1b20);
      if (!bVar3) {
        local_1b21 = _::Debug::shouldLog(ERROR);
        while (local_1b21 != false) {
          _::Debug::log<char_const(&)[45]>
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                     ,0xed,ERROR,"\"failed: expected \" \"url.host == \\\"capnproto.org\\\"\"",
                     (char (*) [45])"failed: expected url.host == \"capnproto.org\"");
          local_1b21 = false;
        }
      }
      pvStack_1b30 = (void *)0x0;
      bVar3 = Vector<kj::String>::operator==
                        ((Vector<kj::String> *)&url_15.host.content.disposer,
                         &stack0xffffffffffffe4d0);
      if (!bVar3) {
        local_1b31 = _::Debug::shouldLog(ERROR);
        while (local_1b31 != false) {
          _::Debug::log<char_const(&)[37]>
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                     ,0xee,ERROR,"\"failed: expected \" \"url.path == nullptr\"",
                     (char (*) [37])"failed: expected url.path == nullptr");
          local_1b31 = false;
        }
      }
      if (((byte)url_15.path.builder.disposer & 1) != 0) {
        local_1b32 = _::Debug::shouldLog(ERROR);
        while (local_1b32 != false) {
          _::Debug::log<char_const(&)[39]>
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                     ,0xef,ERROR,"\"failed: expected \" \"!url.hasTrailingSlash\"",
                     (char (*) [39])"failed: expected !url.hasTrailingSlash");
          local_1b32 = false;
        }
      }
      pvStack_1b40 = (void *)0x0;
      bVar3 = Vector<kj::Url::QueryParam>::operator==
                        ((Vector<kj::Url::QueryParam> *)&url_15.hasTrailingSlash,
                         &stack0xffffffffffffe4c0);
      if (!bVar3) {
        url_16._223_1_ = _::Debug::shouldLog(ERROR);
        while (url_16._223_1_ != '\0') {
          _::Debug::log<char_const(&)[38]>
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                     ,0xf0,ERROR,"\"failed: expected \" \"url.query == nullptr\"",
                     (char (*) [38])"failed: expected url.query == nullptr");
          url_16._223_1_ = 0;
        }
      }
      bVar3 = Maybe<kj::String>::operator==
                        ((Maybe<kj::String> *)&url_15.query.builder.disposer,(void *)0x0);
      if (!bVar3) {
        url_16._222_1_ = _::Debug::shouldLog(ERROR);
        while (url_16._222_1_ != '\0') {
          _::Debug::log<char_const(&)[41]>
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                     ,0xf1,ERROR,"\"failed: expected \" \"url.fragment == nullptr\"",
                     (char (*) [41])"failed: expected url.fragment == nullptr");
          url_16._222_1_ = 0;
        }
      }
      Url::~Url((Url *)local_1a98);
      StringPtr::StringPtr((StringPtr *)&local_1c38,"https://$foo&:12+,34@capnproto.org");
      StringPtr::StringPtr((StringPtr *)&local_1c48,(void *)0x0);
      local_1c4a = 1;
      parseAndCheck((Url *)local_1c28,(StringPtr)local_1c38,(StringPtr)local_1c48,(Options)0x1);
      StringPtr::StringPtr((StringPtr *)local_1c60,"https");
      bVar3 = String::operator==((String *)local_1c28,(StringPtr *)local_1c60);
      if (!bVar3) {
        user_1._7_1_ = _::Debug::shouldLog(ERROR);
        while ((bool)user_1._7_1_ != false) {
          _::Debug::log<char_const(&)[39]>
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                     ,0xf6,ERROR,"\"failed: expected \" \"url.scheme == \\\"https\\\"\"",
                     (char (*) [39])"failed: expected url.scheme == \"https\"");
          user_1._7_1_ = false;
        }
      }
      local_1c78 = _::readMaybe<kj::Url::UserInfo>
                             ((Maybe<kj::Url::UserInfo> *)&url_16.scheme.content.disposer);
      if (local_1c78 == (UserInfo *)0x0) {
        _::Debug::Fault::Fault
                  (&local_1c80,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                   ,0xf7,FAILED,"url.userInfo != nullptr","");
        _::Debug::Fault::fatal(&local_1c80);
      }
      ppUVar7 = mv<kj::Url::UserInfo*>(&local_1c78);
      pUVar2 = *ppUVar7;
      local_1c88 = pUVar2;
      _kj_result_10 = pUVar2;
      StringPtr::StringPtr((StringPtr *)local_1c98,"$foo&");
      bVar3 = String::operator==(&pUVar2->username,(StringPtr *)local_1c98);
      if (!bVar3) {
        _kj_result_11._7_1_ = _::Debug::shouldLog(ERROR);
        while ((bool)_kj_result_11._7_1_ != false) {
          _::Debug::log<char_const(&)[42]>
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                     ,0xf8,ERROR,"\"failed: expected \" \"user.username == \\\"$foo&\\\"\"",
                     (char (*) [42])"failed: expected user.username == \"$foo&\"");
          _kj_result_11._7_1_ = false;
        }
      }
      local_1ca8 = _::readMaybe<kj::String>(&_kj_result_10->password);
      if (local_1ca8 == (String *)0x0) {
        _::Debug::Fault::Fault
                  (&local_1cb0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                   ,0xf9,FAILED,"user.password != nullptr","");
        _::Debug::Fault::fatal(&local_1cb0);
      }
      ppSVar6 = mv<kj::String*>(&local_1ca8);
      pSVar1 = *ppSVar6;
      local_1cb8 = pSVar1;
      StringPtr::StringPtr((StringPtr *)local_1cc8,"12+,34");
      bVar3 = String::operator==(pSVar1,(StringPtr *)local_1cc8);
      if (!bVar3) {
        local_1cc9 = _::Debug::shouldLog(ERROR);
        while (local_1cc9 != false) {
          _::Debug::log<char_const(&)[62]>
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                     ,0xf9,ERROR,
                     "\"failed: expected \" \"KJ_ASSERT_NONNULL(user.password) == \\\"12+,34\\\"\"",
                     (char (*) [62])
                     "failed: expected KJ_ASSERT_NONNULL(user.password) == \"12+,34\"");
          local_1cc9 = false;
        }
      }
      StringPtr::StringPtr((StringPtr *)local_1ce0,"capnproto.org");
      bVar3 = String::operator==((String *)
                                 ((long)&url_16.userInfo.ptr.field_1.value.password.ptr.field_1 +
                                 0x10),(StringPtr *)local_1ce0);
      if (!bVar3) {
        local_1ce1 = _::Debug::shouldLog(ERROR);
        while (local_1ce1 != false) {
          _::Debug::log<char_const(&)[45]>
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                     ,0xfa,ERROR,"\"failed: expected \" \"url.host == \\\"capnproto.org\\\"\"",
                     (char (*) [45])"failed: expected url.host == \"capnproto.org\"");
          local_1ce1 = false;
        }
      }
      pvStack_1cf0 = (void *)0x0;
      bVar3 = Vector<kj::String>::operator==
                        ((Vector<kj::String> *)&url_16.host.content.disposer,
                         &stack0xffffffffffffe310);
      if (!bVar3) {
        local_1cf1 = _::Debug::shouldLog(ERROR);
        while (local_1cf1 != false) {
          _::Debug::log<char_const(&)[37]>
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                     ,0xfb,ERROR,"\"failed: expected \" \"url.path == nullptr\"",
                     (char (*) [37])"failed: expected url.path == nullptr");
          local_1cf1 = false;
        }
      }
      if (((byte)url_16.path.builder.disposer & 1) != 0) {
        local_1cf2 = _::Debug::shouldLog(ERROR);
        while (local_1cf2 != false) {
          _::Debug::log<char_const(&)[39]>
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                     ,0xfc,ERROR,"\"failed: expected \" \"!url.hasTrailingSlash\"",
                     (char (*) [39])"failed: expected !url.hasTrailingSlash");
          local_1cf2 = false;
        }
      }
      pvStack_1d00 = (void *)0x0;
      bVar3 = Vector<kj::Url::QueryParam>::operator==
                        ((Vector<kj::Url::QueryParam> *)&url_16.hasTrailingSlash,
                         &stack0xffffffffffffe300);
      if (!bVar3) {
        url_17._223_1_ = _::Debug::shouldLog(ERROR);
        while (url_17._223_1_ != '\0') {
          _::Debug::log<char_const(&)[38]>
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                     ,0xfd,ERROR,"\"failed: expected \" \"url.query == nullptr\"",
                     (char (*) [38])"failed: expected url.query == nullptr");
          url_17._223_1_ = 0;
        }
      }
      bVar3 = Maybe<kj::String>::operator==
                        ((Maybe<kj::String> *)&url_16.query.builder.disposer,(void *)0x0);
      if (!bVar3) {
        url_17._222_1_ = _::Debug::shouldLog(ERROR);
        while (url_17._222_1_ != '\0') {
          _::Debug::log<char_const(&)[41]>
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                     ,0xfe,ERROR,"\"failed: expected \" \"url.fragment == nullptr\"",
                     (char (*) [41])"failed: expected url.fragment == nullptr");
          url_17._222_1_ = 0;
        }
      }
      Url::~Url((Url *)local_1c28);
      StringPtr::StringPtr((StringPtr *)&local_1df8,"https://[2001:db8::1234]:80/foo");
      StringPtr::StringPtr((StringPtr *)&local_1e08,(void *)0x0);
      local_1e0a = 1;
      parseAndCheck((Url *)local_1de8,(StringPtr)local_1df8,(StringPtr)local_1e08,(Options)0x1);
      StringPtr::StringPtr((StringPtr *)local_1e20,"https");
      bVar3 = String::operator==((String *)local_1de8,(StringPtr *)local_1e20);
      if (!bVar3) {
        local_1e21 = _::Debug::shouldLog(ERROR);
        while (local_1e21 != false) {
          _::Debug::log<char_const(&)[39]>
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                     ,0x103,ERROR,"\"failed: expected \" \"url.scheme == \\\"https\\\"\"",
                     (char (*) [39])"failed: expected url.scheme == \"https\"");
          local_1e21 = false;
        }
      }
      bVar3 = Maybe<kj::Url::UserInfo>::operator==
                        ((Maybe<kj::Url::UserInfo> *)&url_17.scheme.content.disposer,(void *)0x0);
      if (!bVar3) {
        local_1e22 = _::Debug::shouldLog(ERROR);
        while (local_1e22 != false) {
          _::Debug::log<char_const(&)[41]>
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                     ,0x104,ERROR,"\"failed: expected \" \"url.userInfo == nullptr\"",
                     (char (*) [41])"failed: expected url.userInfo == nullptr");
          local_1e22 = false;
        }
      }
      StringPtr::StringPtr((StringPtr *)local_1e38,"[2001:db8::1234]:80");
      bVar3 = String::operator==((String *)
                                 ((long)&url_17.userInfo.ptr.field_1.value.password.ptr.field_1 +
                                 0x10),(StringPtr *)local_1e38);
      if (!bVar3) {
        local_1e39 = _::Debug::shouldLog(ERROR);
        while (local_1e39 != false) {
          _::Debug::log<char_const(&)[51]>
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                     ,0x105,ERROR,
                     "\"failed: expected \" \"url.host == \\\"[2001:db8::1234]:80\\\"\"",
                     (char (*) [51])"failed: expected url.host == \"[2001:db8::1234]:80\"");
          local_1e39 = false;
        }
      }
      local_1e50 = Vector<kj::String>::asPtr((Vector<kj::String> *)&url_17.host.content.disposer);
      StringPtr::StringPtr((StringPtr *)local_1e80,"foo");
      local_1e70 = (iterator)local_1e80;
      local_1e68 = 1;
      init_00._M_len = 1;
      init_00._M_array = local_1e70;
      ArrayPtr<const_kj::StringPtr>::ArrayPtr(&local_1e60,init_00);
      bVar3 = ArrayPtr<kj::String>::operator==(&local_1e50,&local_1e60);
      if (!bVar3) {
        local_1e81 = _::Debug::shouldLog(ERROR);
        while (local_1e81 != false) {
          _::Debug::log<char_const(&)[76]>
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                     ,0x106,ERROR,
                     "\"failed: expected \" \"url.path.asPtr() == kj::ArrayPtr<const StringPtr>({\\\"foo\\\"})\""
                     ,(char (*) [76])
                      "failed: expected url.path.asPtr() == kj::ArrayPtr<const StringPtr>({\"foo\"})"
                    );
          local_1e81 = false;
        }
      }
      if (((byte)url_17.path.builder.disposer & 1) != 0) {
        local_1e82 = _::Debug::shouldLog(ERROR);
        while (local_1e82 != false) {
          _::Debug::log<char_const(&)[39]>
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                     ,0x107,ERROR,"\"failed: expected \" \"!url.hasTrailingSlash\"",
                     (char (*) [39])"failed: expected !url.hasTrailingSlash");
          local_1e82 = false;
        }
      }
      pvStack_1e90 = (void *)0x0;
      bVar3 = Vector<kj::Url::QueryParam>::operator==
                        ((Vector<kj::Url::QueryParam> *)&url_17.hasTrailingSlash,
                         &stack0xffffffffffffe170);
      if (!bVar3) {
        url_18._223_1_ = _::Debug::shouldLog(ERROR);
        while (url_18._223_1_ != '\0') {
          _::Debug::log<char_const(&)[38]>
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                     ,0x108,ERROR,"\"failed: expected \" \"url.query == nullptr\"",
                     (char (*) [38])"failed: expected url.query == nullptr");
          url_18._223_1_ = 0;
        }
      }
      bVar3 = Maybe<kj::String>::operator==
                        ((Maybe<kj::String> *)&url_17.query.builder.disposer,(void *)0x0);
      if (!bVar3) {
        url_18._222_1_ = _::Debug::shouldLog(ERROR);
        while (url_18._222_1_ != '\0') {
          _::Debug::log<char_const(&)[41]>
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                     ,0x109,ERROR,"\"failed: expected \" \"url.fragment == nullptr\"",
                     (char (*) [41])"failed: expected url.fragment == nullptr");
          url_18._222_1_ = 0;
        }
      }
      Url::~Url((Url *)local_1de8);
      StringPtr::StringPtr((StringPtr *)&local_1f88,"https://capnproto.org/foo%2Fbar/baz");
      StringPtr::StringPtr((StringPtr *)&local_1f98,(void *)0x0);
      local_1f9a = 1;
      parseAndCheck((Url *)local_1f78,(StringPtr)local_1f88,(StringPtr)local_1f98,(Options)0x1);
      local_1fb0 = Vector<kj::String>::asPtr((Vector<kj::String> *)&url_18.host.content.disposer);
      StringPtr::StringPtr((StringPtr *)local_1ff0,"foo/bar");
      StringPtr::StringPtr(&local_1fe0,"baz");
      local_1fd0 = (iterator)local_1ff0;
      local_1fc8 = 2;
      init._M_len = 2;
      init._M_array = local_1fd0;
      ArrayPtr<const_kj::StringPtr>::ArrayPtr(&local_1fc0,init);
      bVar3 = ArrayPtr<kj::String>::operator==(&local_1fb0,&local_1fc0);
      if (!bVar3) {
        local_1ff1 = _::Debug::shouldLog(ERROR);
        while (local_1ff1 != false) {
          _::Debug::log<char_const(&)[87]>
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                     ,0x10e,ERROR,
                     "\"failed: expected \" \"url.path.asPtr() == kj::ArrayPtr<const StringPtr>({\\\"foo/bar\\\", \\\"baz\\\"})\""
                     ,(char (*) [87])
                      "failed: expected url.path.asPtr() == kj::ArrayPtr<const StringPtr>({\"foo/bar\", \"baz\"})"
                    );
          local_1ff1 = false;
        }
      }
      Url::~Url((Url *)local_1f78);
      StringPtr::StringPtr((StringPtr *)&local_20e8,"https://capnproto.org/foo/bar?");
      StringPtr::StringPtr((StringPtr *)&local_20f8,"https://capnproto.org/foo/bar");
      local_20fa = 1;
      parseAndCheck(&local_20d8,(StringPtr)local_20e8,(StringPtr)local_20f8,(Options)0x1);
      Url::~Url(&local_20d8);
      StringPtr::StringPtr((StringPtr *)&local_21f0,"https://capnproto.org/foo/bar?#");
      StringPtr::StringPtr((StringPtr *)&local_2200,"https://capnproto.org/foo/bar#");
      local_2202 = 1;
      parseAndCheck(&local_21e0,(StringPtr)local_21f0,(StringPtr)local_2200,(Options)0x1);
      Url::~Url(&local_21e0);
      StringPtr::StringPtr((StringPtr *)&local_22f8,"https://capnproto.org/foo/bar#");
      StringPtr::StringPtr((StringPtr *)&local_2308,(void *)0x0);
      local_230a = 1;
      parseAndCheck(&local_22e8,(StringPtr)local_22f8,(StringPtr)local_2308,(Options)0x1);
      Url::~Url(&local_22e8);
      StringPtr::StringPtr((StringPtr *)&local_2400,"hTtP://capNprotO.org/fOo/bAr");
      StringPtr::StringPtr((StringPtr *)&local_2410,"http://capnproto.org/fOo/bAr");
      local_2412 = 1;
      parseAndCheck(&local_23f0,(StringPtr)local_2400,(StringPtr)local_2410,(Options)0x1);
      Url::~Url(&local_23f0);
      StringPtr::StringPtr((StringPtr *)&local_2508,"https://bad_domain.capnproto.org/");
      StringPtr::StringPtr((StringPtr *)&local_2518,(void *)0x0);
      local_251a = 1;
      parseAndCheck(&local_24f8,(StringPtr)local_2508,(StringPtr)local_2518,(Options)0x1);
      Url::~Url(&local_24f8);
      StringPtr::StringPtr((StringPtr *)&local_2610,"https://foo%25bar:baz%25qux@capnproto.org/");
      StringPtr::StringPtr((StringPtr *)&local_2620,(void *)0x0);
      local_2622 = 1;
      parseAndCheck(&local_2600,(StringPtr)local_2610,(StringPtr)local_2620,(Options)0x1);
      Url::~Url(&local_2600);
      StringPtr::StringPtr((StringPtr *)&local_2718,"https://capnproto.org/foo%25bar");
      StringPtr::StringPtr((StringPtr *)&local_2728,(void *)0x0);
      local_272a = 1;
      parseAndCheck(&local_2708,(StringPtr)local_2718,(StringPtr)local_2728,(Options)0x1);
      Url::~Url(&local_2708);
      StringPtr::StringPtr((StringPtr *)&local_2820,"https://capnproto.org/?foo%25bar=baz%25qux");
      StringPtr::StringPtr((StringPtr *)&local_2830,(void *)0x0);
      local_2832 = 1;
      parseAndCheck(&local_2810,(StringPtr)local_2820,(StringPtr)local_2830,(Options)0x1);
      Url::~Url(&local_2810);
      StringPtr::StringPtr((StringPtr *)&local_2928,"https://capnproto.org/#foo%25bar");
      StringPtr::StringPtr((StringPtr *)&local_2938,(void *)0x0);
      local_293a = 1;
      parseAndCheck(&local_2918,(StringPtr)local_2928,(StringPtr)local_2938,(Options)0x1);
      Url::~Url(&local_2918);
      StringPtr::StringPtr
                ((StringPtr *)&local_2a30,
                 "https://capnproto.org/foo//bar///test//?foo=bar&&baz=qux&");
      StringPtr::StringPtr((StringPtr *)&local_2a40,(void *)0x0);
      local_2a42 = 0x101;
      parseAndCheck(&local_2a20,(StringPtr)local_2a30,(StringPtr)local_2a40,(Options)0x101);
      Url::~Url(&local_2a20);
      StringPtr::StringPtr((StringPtr *)&local_2b38,"https://capnproto.org/foo//../bar/.");
      StringPtr::StringPtr((StringPtr *)&local_2b48,"https://capnproto.org/foo/bar/");
      url_19._222_2_ = 0x101;
      parseAndCheck(&local_2b28,(StringPtr)local_2b38,(StringPtr)local_2b48,(Options)0x101);
      Url::~Url(&local_2b28);
      StringPtr::StringPtr((StringPtr *)&local_2c40,"https://foo/");
      StringPtr::StringPtr((StringPtr *)auStack_2c50,(void *)0x0);
      url_20._222_2_ = 0x101;
      parseAndCheck((Url *)local_2c30,(StringPtr)local_2c40,(StringPtr)_auStack_2c50,(Options)0x101)
      ;
      sVar4 = Vector<kj::String>::size((Vector<kj::String> *)&url_19.host.content.disposer);
      if (sVar4 != 0) {
        url_20._221_1_ = _::Debug::shouldLog(ERROR);
        while (url_20._221_1_ != '\0') {
          _::Debug::log<char_const(&)[38]>
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                     ,300,ERROR,"\"failed: expected \" \"url.path.size() == 0\"",
                     (char (*) [38])"failed: expected url.path.size() == 0");
          url_20._221_1_ = 0;
        }
      }
      if (((byte)url_19.path.builder.disposer & 1) == 0) {
        url_20._220_1_ = _::Debug::shouldLog(ERROR);
        while (url_20._220_1_ != '\0') {
          _::Debug::log<char_const(&)[38]>
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                     ,0x12d,ERROR,"\"failed: expected \" \"url.hasTrailingSlash\"",
                     (char (*) [38])"failed: expected url.hasTrailingSlash");
          url_20._220_1_ = 0;
        }
      }
      Url::~Url((Url *)local_2c30);
      StringPtr::StringPtr((StringPtr *)&local_2d48,"https://foo/bar/");
      StringPtr::StringPtr((StringPtr *)auStack_2d58,(void *)0x0);
      parseAndCheck((Url *)local_2d38,(StringPtr)local_2d48,(StringPtr)_auStack_2d58,(Options)0x101)
      ;
      sVar4 = Vector<kj::String>::size((Vector<kj::String> *)&url_20.host.content.disposer);
      if (sVar4 != 1) {
        local_2d5b = _::Debug::shouldLog(ERROR);
        while (local_2d5b != false) {
          _::Debug::log<char_const(&)[38]>
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                     ,0x132,ERROR,"\"failed: expected \" \"url.path.size() == 1\"",
                     (char (*) [38])"failed: expected url.path.size() == 1");
          local_2d5b = false;
        }
      }
      if (((byte)url_20.path.builder.disposer & 1) == 0) {
        local_2d5c = _::Debug::shouldLog(ERROR);
        while (local_2d5c != false) {
          _::Debug::log<char_const(&)[38]>
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                     ,0x133,ERROR,"\"failed: expected \" \"url.hasTrailingSlash\"",
                     (char (*) [38])"failed: expected url.hasTrailingSlash");
          local_2d5c = false;
        }
      }
      Url::~Url((Url *)local_2d38);
      return;
    }
    _::Debug::Fault::Fault
              (&local_1af0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0xea,FAILED,"url.userInfo != nullptr","");
    _::Debug::Fault::fatal(&local_1af0);
  }
  _::Debug::Fault::Fault
            (&local_1810,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
             ,0xd9,FAILED,"url.fragment != nullptr","");
  _::Debug::Fault::fatal(&local_1810);
}

Assistant:

TEST(AsyncIo, SimpleNetwork) {
  auto ioContext = setupAsyncIo();
  auto& network = ioContext.provider->getNetwork();

  Own<ConnectionReceiver> listener;
  Own<AsyncIoStream> server;
  Own<AsyncIoStream> client;

  char receiveBuffer[4];

  auto port = newPromiseAndFulfiller<uint>();

  port.promise.then([&](uint portnum) {
    return network.parseAddress("localhost", portnum);
  }).then([&](Own<NetworkAddress>&& result) {
    return result->connect();
  }).then([&](Own<AsyncIoStream>&& result) {
    client = kj::mv(result);
    return client->write("foo", 3);
  }).detach([](kj::Exception&& exception) {
    KJ_FAIL_EXPECT(exception);
  });

  kj::String result = network.parseAddress("*").then([&](Own<NetworkAddress>&& result) {
    listener = result->listen();
    port.fulfiller->fulfill(listener->getPort());
    return listener->accept();
  }).then([&](Own<AsyncIoStream>&& result) {
    server = kj::mv(result);
    return server->tryRead(receiveBuffer, 3, 4);
  }).then([&](size_t n) {
    EXPECT_EQ(3u, n);
    return heapString(receiveBuffer, n);
  }).wait(ioContext.waitScope);

  EXPECT_EQ("foo", result);
}